

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loopfilter_sse2.c
# Opt level: O1

void aom_lpf_vertical_8_dual_sse2
               (uint8_t *s,int p,uint8_t *_blimit0,uint8_t *_limit0,uint8_t *_thresh0,
               uint8_t *_blimit1,uint8_t *_limit1,uint8_t *_thresh1)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined8 uVar6;
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  undefined1 auVar11 [15];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [15];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  undefined1 auVar23 [15];
  undefined1 auVar24 [15];
  undefined1 auVar25 [15];
  undefined1 auVar26 [15];
  undefined1 auVar27 [15];
  undefined1 auVar28 [15];
  undefined1 auVar29 [15];
  undefined1 auVar30 [15];
  undefined1 auVar31 [15];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  undefined1 auVar36 [15];
  undefined1 auVar37 [15];
  undefined1 auVar38 [15];
  undefined1 auVar39 [15];
  undefined1 auVar40 [15];
  undefined1 auVar41 [15];
  undefined1 auVar42 [15];
  undefined1 auVar43 [15];
  undefined1 auVar44 [15];
  undefined1 auVar45 [15];
  undefined1 auVar46 [15];
  undefined1 auVar47 [15];
  undefined1 auVar48 [15];
  undefined1 auVar49 [15];
  undefined1 auVar50 [15];
  undefined1 auVar51 [15];
  undefined1 auVar52 [15];
  undefined1 auVar53 [15];
  undefined1 auVar54 [15];
  undefined1 auVar55 [15];
  undefined1 auVar56 [15];
  undefined1 auVar57 [15];
  undefined1 auVar58 [15];
  undefined1 auVar59 [15];
  undefined1 auVar60 [15];
  undefined1 auVar61 [15];
  undefined1 auVar62 [15];
  undefined1 auVar63 [15];
  undefined1 auVar64 [15];
  undefined1 auVar65 [15];
  undefined1 auVar66 [15];
  undefined1 auVar67 [15];
  undefined1 auVar68 [15];
  ushort uVar69;
  ushort uVar70;
  undefined1 auVar71 [15];
  undefined1 auVar72 [15];
  undefined1 auVar73 [15];
  undefined1 auVar74 [15];
  undefined1 auVar75 [15];
  undefined1 auVar76 [15];
  undefined1 auVar77 [15];
  undefined1 auVar78 [15];
  undefined1 auVar79 [15];
  undefined1 auVar80 [15];
  byte bVar81;
  byte bVar82;
  byte bVar83;
  byte bVar84;
  byte bVar85;
  byte bVar86;
  byte bVar87;
  byte bVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [12];
  unkbyte10 Var92;
  undefined1 auVar93 [14];
  undefined1 auVar94 [12];
  unkbyte10 Var95;
  undefined1 auVar96 [14];
  undefined1 auVar97 [12];
  unkbyte10 Var98;
  undefined1 auVar99 [14];
  undefined1 auVar100 [12];
  unkbyte10 Var101;
  undefined1 auVar102 [12];
  undefined1 auVar103 [12];
  undefined1 auVar104 [15];
  unkuint9 Var105;
  undefined1 auVar106 [11];
  undefined1 auVar107 [15];
  unkuint9 Var108;
  undefined1 auVar109 [11];
  undefined1 auVar110 [15];
  unkuint9 Var111;
  undefined1 auVar112 [11];
  undefined1 auVar113 [15];
  unkuint9 Var114;
  undefined1 auVar115 [15];
  undefined1 auVar116 [15];
  unkuint9 Var117;
  undefined1 auVar118 [11];
  undefined1 auVar119 [15];
  unkuint9 Var120;
  undefined1 auVar121 [15];
  undefined1 auVar122 [15];
  unkuint9 Var123;
  undefined1 auVar124 [11];
  undefined1 auVar125 [15];
  undefined1 auVar126 [11];
  undefined1 auVar127 [14];
  undefined1 auVar128 [12];
  undefined1 auVar129 [15];
  undefined1 auVar130 [11];
  undefined1 auVar131 [15];
  undefined1 auVar132 [11];
  undefined1 auVar133 [14];
  undefined1 auVar134 [12];
  undefined1 auVar135 [12];
  undefined1 auVar136 [15];
  undefined1 auVar137 [15];
  undefined1 auVar138 [15];
  undefined1 auVar139 [15];
  undefined1 auVar140 [15];
  undefined1 auVar141 [15];
  undefined1 auVar142 [15];
  undefined1 auVar143 [15];
  undefined1 auVar144 [15];
  undefined1 auVar145 [15];
  undefined1 auVar146 [15];
  undefined1 auVar147 [15];
  undefined1 auVar148 [15];
  undefined1 auVar149 [15];
  undefined1 auVar150 [15];
  undefined1 auVar151 [15];
  undefined1 auVar152 [15];
  undefined1 auVar153 [15];
  long lVar154;
  byte bVar155;
  short sVar157;
  short sVar158;
  undefined8 uVar159;
  undefined1 uVar169;
  undefined1 uVar173;
  short sVar177;
  undefined1 uVar180;
  undefined1 uVar184;
  short sVar188;
  undefined1 uVar191;
  undefined1 uVar195;
  undefined1 uVar202;
  short sVar206;
  short sVar209;
  short sVar212;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  byte bVar171;
  byte bVar175;
  byte bVar182;
  byte bVar186;
  byte bVar193;
  byte bVar197;
  byte bVar204;
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  short sVar178;
  short sVar179;
  short sVar189;
  short sVar190;
  short sVar199;
  short sVar200;
  short sVar201;
  short sVar207;
  short sVar208;
  short sVar210;
  short sVar211;
  short sVar213;
  short sVar214;
  short sVar215;
  short sVar216;
  undefined1 auVar166 [16];
  ushort uVar217;
  undefined4 uVar218;
  undefined1 auVar220 [12];
  ushort uVar241;
  ushort uVar244;
  ushort uVar245;
  undefined1 auVar221 [14];
  ushort uVar239;
  short sVar240;
  ushort uVar243;
  undefined1 auVar222 [16];
  undefined1 auVar232 [16];
  undefined2 uVar246;
  undefined4 uVar247;
  undefined1 auVar251 [12];
  undefined1 uVar265;
  undefined1 uVar267;
  undefined1 uVar269;
  undefined1 uVar271;
  undefined1 uVar273;
  undefined1 uVar275;
  undefined1 uVar277;
  undefined1 auVar253 [16];
  undefined1 auVar262 [16];
  undefined1 uVar292;
  undefined1 uVar294;
  undefined1 uVar296;
  undefined1 uVar298;
  undefined1 uVar300;
  undefined1 uVar302;
  undefined1 uVar304;
  undefined1 auVar279 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  ushort uVar306;
  ulong uVar307;
  undefined1 uVar312;
  undefined1 uVar313;
  short sVar314;
  ushort uVar315;
  short sVar316;
  undefined1 uVar317;
  undefined1 uVar318;
  short sVar319;
  ushort uVar320;
  short sVar321;
  undefined1 uVar322;
  undefined1 uVar323;
  short sVar324;
  ushort uVar325;
  short sVar326;
  undefined1 uVar327;
  short sVar328;
  ushort uVar329;
  short sVar330;
  short sVar331;
  ushort uVar332;
  short sVar333;
  short sVar334;
  ushort uVar335;
  short sVar336;
  undefined1 auVar308 [16];
  undefined1 auVar311 [16];
  ushort uVar337;
  undefined1 auVar340 [14];
  undefined8 uVar338;
  undefined1 auVar339 [12];
  ulong uVar362;
  undefined1 auVar342 [16];
  undefined1 auVar343 [16];
  undefined1 auVar351 [16];
  undefined1 auVar352 [16];
  undefined1 auVar353 [16];
  short sVar363;
  undefined1 auVar364 [12];
  short sVar373;
  short sVar374;
  short sVar375;
  short sVar377;
  short sVar378;
  short sVar379;
  undefined1 auVar365 [16];
  undefined1 auVar370 [16];
  undefined1 auVar371 [16];
  undefined1 auVar372 [16];
  short sVar380;
  ushort uVar381;
  ushort uVar383;
  ushort uVar384;
  ushort uVar385;
  ushort uVar386;
  ushort uVar387;
  ushort uVar388;
  ushort uVar389;
  undefined1 auVar382 [16];
  byte bVar390;
  byte bVar391;
  byte bVar396;
  byte bVar399;
  ushort uVar402;
  byte bVar406;
  byte bVar409;
  byte bVar412;
  byte bVar415;
  byte bVar418;
  byte bVar419;
  byte bVar420;
  byte bVar421;
  byte bVar422;
  byte bVar423;
  byte bVar424;
  undefined1 auVar392 [16];
  byte bVar397;
  byte bVar400;
  byte bVar403;
  byte bVar404;
  byte bVar407;
  byte bVar410;
  byte bVar413;
  byte bVar416;
  byte bVar426;
  undefined1 auVar393 [16];
  char cVar398;
  char cVar401;
  char cVar405;
  char cVar408;
  char cVar411;
  char cVar414;
  char cVar417;
  undefined1 auVar394 [16];
  ushort uVar425;
  undefined1 auVar395 [16];
  undefined2 uVar427;
  uint uVar428;
  undefined8 uVar430;
  undefined1 auVar434 [16];
  byte bVar436;
  byte bVar437;
  byte bVar438;
  byte bVar439;
  byte bVar440;
  byte bVar441;
  byte bVar442;
  byte bVar443;
  byte bVar444;
  byte bVar448;
  byte bVar449;
  byte bVar450;
  byte bVar451;
  byte bVar452;
  byte bVar453;
  byte bVar454;
  undefined1 auVar445 [16];
  undefined1 auVar446 [16];
  byte bVar455;
  undefined1 auVar447 [16];
  short sVar459;
  short sVar460;
  short sVar461;
  short sVar462;
  short sVar463;
  short sVar464;
  undefined1 auVar456 [16];
  undefined1 auVar458 [16];
  ushort uVar465;
  undefined1 auVar466 [16];
  ushort uVar467;
  short sVar470;
  short sVar471;
  short sVar472;
  short sVar473;
  short sVar474;
  short sVar475;
  undefined1 auVar468 [16];
  undefined1 auVar469 [16];
  byte bVar156;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 uVar170;
  byte bVar172;
  undefined1 uVar174;
  byte bVar176;
  undefined1 uVar181;
  byte bVar183;
  undefined1 uVar185;
  byte bVar187;
  undefined1 uVar192;
  byte bVar194;
  undefined1 uVar196;
  byte bVar198;
  undefined1 uVar203;
  byte bVar205;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar219 [12];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  undefined1 uVar242;
  undefined6 uVar248;
  undefined1 auVar254 [16];
  undefined1 auVar255 [16];
  undefined1 auVar256 [16];
  undefined1 auVar257 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar260 [16];
  undefined1 auVar249 [12];
  undefined1 auVar250 [12];
  undefined1 auVar261 [16];
  undefined1 auVar252 [14];
  undefined1 auVar264 [16];
  undefined1 auVar263 [16];
  undefined1 uVar266;
  undefined1 uVar268;
  undefined1 uVar270;
  undefined1 uVar272;
  undefined1 uVar274;
  undefined1 uVar276;
  undefined1 uVar278;
  undefined1 auVar288 [16];
  undefined1 auVar280 [16];
  undefined1 auVar281 [16];
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar289 [16];
  undefined1 auVar290 [16];
  undefined1 auVar291 [16];
  undefined1 uVar293;
  undefined1 uVar295;
  undefined1 uVar297;
  undefined1 uVar299;
  undefined1 uVar301;
  undefined1 uVar303;
  undefined1 uVar305;
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar341 [16];
  undefined1 auVar344 [16];
  undefined1 auVar354 [16];
  undefined1 auVar345 [16];
  undefined1 auVar355 [16];
  undefined1 auVar346 [16];
  undefined1 auVar356 [16];
  undefined1 auVar347 [16];
  undefined1 auVar357 [16];
  undefined1 auVar348 [16];
  undefined1 auVar358 [16];
  undefined1 auVar361 [16];
  undefined1 auVar349 [16];
  undefined1 auVar359 [16];
  undefined1 auVar350 [16];
  undefined1 auVar360 [16];
  undefined1 auVar366 [16];
  undefined1 auVar367 [16];
  undefined1 auVar368 [16];
  undefined1 auVar369 [16];
  short sVar376;
  undefined6 uVar429;
  undefined8 uVar431;
  undefined1 auVar432 [12];
  undefined1 auVar433 [14];
  undefined1 auVar435 [16];
  undefined1 auVar457 [16];
  
  bVar81 = *_blimit0;
  bVar82 = _blimit0[1];
  bVar83 = _blimit0[2];
  bVar84 = _blimit0[3];
  bVar85 = _blimit0[4];
  bVar86 = _blimit0[5];
  bVar87 = _blimit0[6];
  bVar391 = _blimit0[7];
  bVar397 = *_blimit1;
  bVar400 = _blimit1[1];
  bVar404 = _blimit1[2];
  bVar407 = _blimit1[3];
  bVar410 = _blimit1[4];
  bVar413 = _blimit1[5];
  bVar416 = _blimit1[6];
  bVar88 = _blimit1[7];
  bVar436 = *_thresh0;
  bVar437 = _thresh0[1];
  bVar438 = _thresh0[2];
  bVar439 = _thresh0[3];
  bVar440 = *_thresh1;
  bVar441 = _thresh1[1];
  bVar442 = _thresh1[2];
  bVar443 = _thresh1[3];
  uVar1 = *(ulong *)(s + -4);
  lVar154 = (long)p;
  uVar159 = *(undefined8 *)(s + lVar154 + -4);
  uVar202 = (undefined1)((ulong)uVar159 >> 0x38);
  uVar242 = (undefined1)(uVar1 >> 0x38);
  auVar229._8_6_ = 0;
  auVar229._0_8_ = uVar1;
  auVar229[0xe] = uVar242;
  auVar229[0xf] = uVar202;
  uVar195 = (undefined1)((ulong)uVar159 >> 0x30);
  auVar228._14_2_ = auVar229._14_2_;
  auVar228._8_5_ = 0;
  auVar228._0_8_ = uVar1;
  auVar228[0xd] = uVar195;
  auVar227._13_3_ = auVar228._13_3_;
  auVar227._8_4_ = 0;
  auVar227._0_8_ = uVar1;
  auVar227[0xc] = (char)(uVar1 >> 0x30);
  uVar191 = (undefined1)((ulong)uVar159 >> 0x28);
  auVar226._12_4_ = auVar227._12_4_;
  auVar226._8_3_ = 0;
  auVar226._0_8_ = uVar1;
  auVar226[0xb] = uVar191;
  auVar225._11_5_ = auVar226._11_5_;
  auVar225._8_2_ = 0;
  auVar225._0_8_ = uVar1;
  auVar225[10] = (char)(uVar1 >> 0x28);
  uVar184 = (undefined1)((ulong)uVar159 >> 0x20);
  auVar224._10_6_ = auVar225._10_6_;
  auVar224[8] = 0;
  auVar224._0_8_ = uVar1;
  auVar224[9] = uVar184;
  auVar223._9_7_ = auVar224._9_7_;
  auVar223[8] = (char)(uVar1 >> 0x20);
  auVar223._0_8_ = uVar1;
  uVar180 = (undefined1)((ulong)uVar159 >> 0x18);
  Var92 = CONCAT91(CONCAT81(auVar223._8_8_,uVar180),(char)(uVar1 >> 0x18));
  uVar173 = (undefined1)((ulong)uVar159 >> 0x10);
  auVar91._2_10_ = Var92;
  auVar91[1] = uVar173;
  auVar91[0] = (char)(uVar1 >> 0x10);
  uVar169 = (undefined1)((ulong)uVar159 >> 8);
  auVar340._2_12_ = auVar91;
  auVar340[1] = uVar169;
  auVar340[0] = (char)(uVar1 >> 8);
  auVar222._0_2_ = CONCAT11((char)uVar159,(byte)uVar1);
  auVar222._2_14_ = auVar340;
  uVar2 = *(ulong *)(s + lVar154 * 2 + -4);
  uVar431 = *(undefined8 *)(s + lVar154 * 3 + -4);
  uVar277 = (undefined1)((ulong)uVar431 >> 0x38);
  uVar203 = (undefined1)(uVar2 >> 0x38);
  auVar160._8_6_ = 0;
  auVar160._0_8_ = uVar2;
  auVar160[0xe] = uVar203;
  auVar160[0xf] = uVar277;
  auVar446._14_2_ = auVar160._14_2_;
  auVar446._8_5_ = 0;
  auVar446._0_8_ = uVar2;
  uVar275 = (undefined1)((ulong)uVar431 >> 0x30);
  auVar446[0xd] = uVar275;
  uVar196 = (undefined1)(uVar2 >> 0x30);
  auVar469._13_3_ = auVar446._13_3_;
  auVar469._8_4_ = 0;
  auVar469._0_8_ = uVar2;
  auVar469[0xc] = uVar196;
  auVar392._12_4_ = auVar469._12_4_;
  auVar392._8_3_ = 0;
  auVar392._0_8_ = uVar2;
  uVar273 = (undefined1)((ulong)uVar431 >> 0x28);
  auVar392[0xb] = uVar273;
  uVar192 = (undefined1)(uVar2 >> 0x28);
  auVar370._11_5_ = auVar392._11_5_;
  auVar370._8_2_ = 0;
  auVar370._0_8_ = uVar2;
  auVar370[10] = uVar192;
  auVar286._10_6_ = auVar370._10_6_;
  auVar286[8] = 0;
  auVar286._0_8_ = uVar2;
  uVar271 = (undefined1)((ulong)uVar431 >> 0x20);
  auVar286[9] = uVar271;
  uVar185 = (undefined1)(uVar2 >> 0x20);
  auVar161._9_7_ = auVar286._9_7_;
  auVar161[8] = uVar185;
  auVar161._0_8_ = uVar2;
  uVar269 = (undefined1)((ulong)uVar431 >> 0x18);
  uVar181 = (undefined1)(uVar2 >> 0x18);
  Var95 = CONCAT91(CONCAT81(auVar161._8_8_,uVar269),uVar181);
  uVar267 = (undefined1)((ulong)uVar431 >> 0x10);
  auVar94._2_10_ = Var95;
  auVar94[1] = uVar267;
  uVar174 = (undefined1)(uVar2 >> 0x10);
  auVar94[0] = uVar174;
  uVar265 = (undefined1)((ulong)uVar431 >> 8);
  auVar93._2_12_ = auVar94;
  auVar93[1] = uVar265;
  uVar170 = (undefined1)(uVar2 >> 8);
  auVar93[0] = uVar170;
  uVar3 = *(ulong *)(s + lVar154 * 4 + -4);
  uVar4 = *(undefined8 *)(s + lVar154 * 5 + -4);
  uVar304 = (undefined1)((ulong)uVar4 >> 0x38);
  uVar278 = (undefined1)(uVar3 >> 0x38);
  auVar260._8_6_ = 0;
  auVar260._0_8_ = uVar3;
  auVar260[0xe] = uVar278;
  auVar260[0xf] = uVar304;
  auVar259._14_2_ = auVar260._14_2_;
  auVar259._8_5_ = 0;
  auVar259._0_8_ = uVar3;
  uVar302 = (undefined1)((ulong)uVar4 >> 0x30);
  auVar259[0xd] = uVar302;
  uVar276 = (undefined1)(uVar3 >> 0x30);
  auVar258._13_3_ = auVar259._13_3_;
  auVar258._8_4_ = 0;
  auVar258._0_8_ = uVar3;
  auVar258[0xc] = uVar276;
  auVar257._12_4_ = auVar258._12_4_;
  auVar257._8_3_ = 0;
  auVar257._0_8_ = uVar3;
  uVar300 = (undefined1)((ulong)uVar4 >> 0x28);
  auVar257[0xb] = uVar300;
  uVar274 = (undefined1)(uVar3 >> 0x28);
  auVar256._11_5_ = auVar257._11_5_;
  auVar256._8_2_ = 0;
  auVar256._0_8_ = uVar3;
  auVar256[10] = uVar274;
  auVar255._10_6_ = auVar256._10_6_;
  auVar255[8] = 0;
  auVar255._0_8_ = uVar3;
  uVar298 = (undefined1)((ulong)uVar4 >> 0x20);
  auVar255[9] = uVar298;
  uVar272 = (undefined1)(uVar3 >> 0x20);
  auVar254._9_7_ = auVar255._9_7_;
  auVar254[8] = uVar272;
  auVar254._0_8_ = uVar3;
  uVar296 = (undefined1)((ulong)uVar4 >> 0x18);
  uVar270 = (undefined1)(uVar3 >> 0x18);
  Var98 = CONCAT91(CONCAT81(auVar254._8_8_,uVar296),uVar270);
  uVar294 = (undefined1)((ulong)uVar4 >> 0x10);
  auVar97._2_10_ = Var98;
  auVar97[1] = uVar294;
  uVar268 = (undefined1)(uVar3 >> 0x10);
  auVar97[0] = uVar268;
  uVar292 = (undefined1)((ulong)uVar4 >> 8);
  auVar96._2_12_ = auVar97;
  auVar96[1] = uVar292;
  uVar266 = (undefined1)(uVar3 >> 8);
  auVar96[0] = uVar266;
  auVar253._0_2_ = CONCAT11((char)uVar4,(char)uVar3);
  auVar253._2_14_ = auVar96;
  uVar5 = *(ulong *)(s + lVar154 * 6 + -4);
  uVar6 = *(undefined8 *)(s + lVar154 * 7 + -4);
  uVar327 = (undefined1)((ulong)uVar6 >> 0x38);
  uVar305 = (undefined1)(uVar5 >> 0x38);
  auVar285._8_6_ = 0;
  auVar285._0_8_ = uVar5;
  auVar285[0xe] = uVar305;
  auVar285[0xf] = uVar327;
  auVar284._14_2_ = auVar285._14_2_;
  auVar284._8_5_ = 0;
  auVar284._0_8_ = uVar5;
  uVar323 = (undefined1)((ulong)uVar6 >> 0x30);
  auVar284[0xd] = uVar323;
  uVar303 = (undefined1)(uVar5 >> 0x30);
  auVar283._13_3_ = auVar284._13_3_;
  auVar283._8_4_ = 0;
  auVar283._0_8_ = uVar5;
  auVar283[0xc] = uVar303;
  auVar282._12_4_ = auVar283._12_4_;
  auVar282._8_3_ = 0;
  auVar282._0_8_ = uVar5;
  uVar322 = (undefined1)((ulong)uVar6 >> 0x28);
  auVar282[0xb] = uVar322;
  uVar301 = (undefined1)(uVar5 >> 0x28);
  auVar281._11_5_ = auVar282._11_5_;
  auVar281._8_2_ = 0;
  auVar281._0_8_ = uVar5;
  auVar281[10] = uVar301;
  auVar280._10_6_ = auVar281._10_6_;
  auVar280[8] = 0;
  auVar280._0_8_ = uVar5;
  uVar318 = (undefined1)((ulong)uVar6 >> 0x20);
  auVar280[9] = uVar318;
  uVar299 = (undefined1)(uVar5 >> 0x20);
  auVar279._9_7_ = auVar280._9_7_;
  auVar279[8] = uVar299;
  auVar279._0_8_ = uVar5;
  uVar317 = (undefined1)((ulong)uVar6 >> 0x18);
  uVar297 = (undefined1)(uVar5 >> 0x18);
  Var101 = CONCAT91(CONCAT81(auVar279._8_8_,uVar317),uVar297);
  uVar313 = (undefined1)((ulong)uVar6 >> 0x10);
  auVar100._2_10_ = Var101;
  auVar100[1] = uVar313;
  uVar295 = (undefined1)(uVar5 >> 0x10);
  auVar100[0] = uVar295;
  uVar312 = (undefined1)((ulong)uVar6 >> 8);
  auVar99._2_12_ = auVar100;
  auVar99[1] = uVar312;
  uVar293 = (undefined1)(uVar5 >> 8);
  auVar99[0] = uVar293;
  uVar381 = (ushort)Var92;
  auVar368._0_12_ = auVar222._0_12_;
  auVar368._12_2_ = uVar381;
  auVar368._14_2_ = (short)Var95;
  auVar367._12_4_ = auVar368._12_4_;
  auVar367._0_10_ = auVar222._0_10_;
  auVar367._10_2_ = auVar94._0_2_;
  uVar241 = auVar91._0_2_;
  auVar366._10_6_ = auVar367._10_6_;
  auVar366._0_8_ = auVar222._0_8_;
  auVar366._8_2_ = uVar241;
  auVar102._4_8_ = auVar366._8_8_;
  auVar102._2_2_ = auVar93._0_2_;
  uVar243 = auVar340._0_2_;
  auVar102._0_2_ = uVar243;
  auVar365._0_4_ = CONCAT22(CONCAT11((char)uVar431,(char)uVar2),auVar222._0_2_);
  auVar365._4_12_ = auVar102;
  auVar310._0_12_ = auVar253._0_12_;
  auVar310._12_2_ = (short)Var98;
  auVar310._14_2_ = (short)Var101;
  auVar309._12_4_ = auVar310._12_4_;
  auVar309._0_10_ = auVar253._0_10_;
  auVar309._10_2_ = auVar100._0_2_;
  auVar308._10_6_ = auVar309._10_6_;
  auVar308._0_8_ = auVar253._0_8_;
  auVar308._8_2_ = auVar97._0_2_;
  auVar103._4_8_ = auVar308._8_8_;
  auVar103._2_2_ = auVar99._0_2_;
  auVar103._0_2_ = auVar96._0_2_;
  auVar341._0_8_ = auVar365._0_8_;
  auVar341._8_4_ = auVar102._0_4_;
  auVar341._12_4_ = auVar103._0_4_;
  uVar362 = auVar341._8_8_;
  uVar338 = CONCAT44(CONCAT22(CONCAT11((char)uVar6,(char)uVar5),auVar253._0_2_),auVar365._0_4_);
  auVar364._0_8_ = CONCAT44(auVar308._8_4_,auVar366._8_4_);
  auVar364._8_4_ = auVar367._12_4_;
  auVar369._12_4_ = auVar309._12_4_;
  auVar369._0_12_ = auVar364;
  uVar217 = auVar223._8_2_;
  uVar218 = CONCAT22(auVar161._8_2_,uVar217);
  uVar465 = auVar225._10_2_;
  auVar219._0_8_ = CONCAT26(auVar370._10_2_,CONCAT24(uVar465,uVar218));
  uVar239 = auVar227._12_2_;
  auVar219._8_2_ = uVar239;
  auVar219._10_2_ = auVar469._12_2_;
  auVar230._12_2_ = auVar228._14_2_;
  auVar230._0_12_ = auVar219;
  auVar230._14_2_ = auVar446._14_2_;
  uVar247 = CONCAT22(auVar279._8_2_,auVar254._8_2_);
  auVar249._0_8_ = CONCAT26(auVar281._10_2_,CONCAT24(auVar256._10_2_,uVar247));
  auVar249._8_2_ = auVar258._12_2_;
  auVar249._10_2_ = auVar283._12_2_;
  auVar261._12_2_ = auVar259._14_2_;
  auVar261._0_12_ = auVar249;
  auVar261._14_2_ = auVar284._14_2_;
  auVar457._8_4_ = (int)((ulong)auVar219._0_8_ >> 0x20);
  auVar457._0_8_ = auVar219._0_8_;
  auVar457._12_4_ = (int)((ulong)auVar249._0_8_ >> 0x20);
  auVar456._8_8_ = auVar457._8_8_;
  auVar456._0_8_ = CONCAT44(uVar247,uVar218);
  auVar220._0_8_ = CONCAT44(auVar249._8_4_,auVar219._8_4_);
  auVar220._8_4_ = auVar230._12_4_;
  auVar231._12_4_ = auVar261._12_4_;
  auVar231._0_12_ = auVar220;
  auVar221 = auVar231._0_14_;
  auVar468._8_8_ = auVar456._8_8_;
  auVar468._0_8_ = auVar364._0_8_;
  auVar445._0_8_ = auVar369._8_8_;
  auVar445._8_8_ = auVar456._0_8_;
  auVar466._8_8_ = auVar364._0_8_;
  auVar466._0_8_ = auVar445._0_8_;
  auVar262._8_8_ = auVar456._8_8_;
  auVar262._0_8_ = auVar456._0_8_;
  auVar161 = psubusb(auVar468,auVar445);
  auVar286 = psubusb(auVar445,auVar468);
  auVar286 = auVar286 | auVar161;
  auVar161 = psubusb(auVar466,auVar262);
  auVar370 = psubusb(auVar262,auVar466);
  auVar370 = auVar370 | auVar161;
  bVar444 = auVar286[0];
  bVar156 = auVar286[8];
  bVar155 = (bVar156 < bVar444) * bVar444 | (bVar156 >= bVar444) * bVar156;
  bVar448 = auVar286[1];
  bVar172 = auVar286[9];
  bVar171 = (bVar172 < bVar448) * bVar448 | (bVar172 >= bVar448) * bVar172;
  bVar449 = auVar286[2];
  bVar176 = auVar286[10];
  bVar175 = (bVar176 < bVar449) * bVar449 | (bVar176 >= bVar449) * bVar176;
  bVar450 = auVar286[3];
  bVar183 = auVar286[0xb];
  bVar182 = (bVar183 < bVar450) * bVar450 | (bVar183 >= bVar450) * bVar183;
  bVar451 = auVar286[4];
  bVar187 = auVar286[0xc];
  bVar186 = (bVar187 < bVar451) * bVar451 | (bVar187 >= bVar451) * bVar187;
  bVar452 = auVar286[5];
  bVar194 = auVar286[0xd];
  bVar193 = (bVar194 < bVar452) * bVar452 | (bVar194 >= bVar452) * bVar194;
  bVar453 = auVar286[6];
  bVar198 = auVar286[0xe];
  bVar197 = (bVar198 < bVar453) * bVar453 | (bVar198 >= bVar453) * bVar198;
  bVar454 = auVar286[7];
  bVar205 = auVar286[0xf];
  bVar204 = (bVar205 < bVar454) * bVar454 | (bVar205 >= bVar454) * bVar205;
  uVar247 = CONCAT13(-((byte)((bVar182 < bVar439) * bVar182 | (bVar182 >= bVar439) * bVar439) ==
                      bVar182),
                     CONCAT12(-((byte)((bVar175 < bVar438) * bVar175 |
                                      (bVar175 >= bVar438) * bVar438) == bVar175),
                              CONCAT11(-((byte)((bVar171 < bVar437) * bVar171 |
                                               (bVar171 >= bVar437) * bVar437) == bVar171),
                                       -((byte)((bVar155 < bVar436) * bVar155 |
                                               (bVar155 >= bVar436) * bVar436) == bVar155))));
  uVar430 = CONCAT17(-((byte)((bVar204 < bVar443) * bVar204 | (bVar204 >= bVar443) * bVar443) ==
                      bVar204),
                     CONCAT16(-((byte)((bVar197 < bVar442) * bVar197 |
                                      (bVar197 >= bVar442) * bVar442) == bVar197),
                              CONCAT15(-((byte)((bVar193 < bVar441) * bVar193 |
                                               (bVar193 >= bVar441) * bVar441) == bVar193),
                                       CONCAT14(-((byte)((bVar186 < bVar440) * bVar186 |
                                                        (bVar186 >= bVar440) * bVar440) == bVar186),
                                                uVar247))));
  auVar161 = paddusb(auVar370,auVar370);
  auVar162._0_2_ = auVar370._8_2_ >> 1;
  auVar162._2_2_ = auVar370._10_2_ >> 1;
  auVar162._4_2_ = auVar370._12_2_ >> 1;
  auVar162._6_2_ = auVar370._14_2_ >> 1;
  auVar162._8_8_ = 0;
  auVar371._0_8_ = auVar161._0_8_;
  auVar371._8_4_ = auVar161._0_4_;
  auVar371._12_4_ = auVar161._4_4_;
  auVar161 = paddusb(auVar162 & _DAT_004d97b0,auVar371);
  auVar372._8_8_ = auVar220._0_8_;
  auVar372._0_8_ = uVar362;
  bVar437 = auVar161[0];
  bVar438 = auVar161[1];
  bVar439 = auVar161[2];
  bVar440 = auVar161[3];
  bVar441 = auVar161[4];
  bVar442 = auVar161[5];
  bVar443 = auVar161[6];
  bVar155 = auVar161[7];
  bVar171 = auVar161[8];
  bVar175 = auVar161[9];
  bVar182 = auVar161[10];
  bVar186 = auVar161[0xb];
  bVar193 = auVar161[0xc];
  bVar197 = auVar161[0xd];
  bVar204 = auVar161[0xe];
  bVar455 = auVar161[0xf];
  auVar161 = psubusb(auVar372,auVar468);
  auVar469 = psubusb(auVar468,auVar372);
  auVar469 = auVar469 | auVar161;
  uVar307 = auVar231._8_8_;
  auVar163._8_8_ = uVar307;
  auVar163._0_8_ = uVar338;
  auVar392 = psubusb(auVar372,auVar163);
  auVar286 = psubusb(auVar372,auVar445);
  auVar370 = psubusb(auVar163,auVar445);
  auVar446 = psubusb(auVar445,auVar163);
  auVar161 = psubusb(auVar163,auVar372);
  auVar392 = auVar392 | auVar161;
  bVar436 = auVar469[0];
  bVar390 = auVar392[0];
  bVar390 = (bVar390 < bVar436) * bVar436 | (bVar390 >= bVar436) * bVar390;
  bVar436 = auVar469[1];
  bVar396 = auVar392[1];
  bVar396 = (bVar396 < bVar436) * bVar436 | (bVar396 >= bVar436) * bVar396;
  bVar436 = auVar469[2];
  bVar399 = auVar392[2];
  bVar399 = (bVar399 < bVar436) * bVar436 | (bVar399 >= bVar436) * bVar399;
  bVar436 = auVar469[3];
  bVar403 = auVar392[3];
  bVar403 = (bVar403 < bVar436) * bVar436 | (bVar403 >= bVar436) * bVar403;
  bVar436 = auVar469[4];
  bVar406 = auVar392[4];
  bVar406 = (bVar406 < bVar436) * bVar436 | (bVar406 >= bVar436) * bVar406;
  bVar436 = auVar469[5];
  bVar409 = auVar392[5];
  bVar409 = (bVar409 < bVar436) * bVar436 | (bVar409 >= bVar436) * bVar409;
  bVar436 = auVar469[6];
  bVar412 = auVar392[6];
  bVar412 = (bVar412 < bVar436) * bVar436 | (bVar412 >= bVar436) * bVar412;
  bVar436 = auVar469[7];
  bVar415 = auVar392[7];
  bVar415 = (bVar415 < bVar436) * bVar436 | (bVar415 >= bVar436) * bVar415;
  bVar436 = auVar469[8];
  bVar418 = auVar392[8];
  bVar418 = (bVar418 < bVar436) * bVar436 | (bVar418 >= bVar436) * bVar418;
  bVar436 = auVar469[9];
  bVar419 = auVar392[9];
  bVar419 = (bVar419 < bVar436) * bVar436 | (bVar419 >= bVar436) * bVar419;
  bVar436 = auVar469[10];
  bVar420 = auVar392[10];
  bVar420 = (bVar420 < bVar436) * bVar436 | (bVar420 >= bVar436) * bVar420;
  bVar436 = auVar469[0xb];
  bVar421 = auVar392[0xb];
  bVar421 = (bVar421 < bVar436) * bVar436 | (bVar421 >= bVar436) * bVar421;
  bVar436 = auVar469[0xc];
  bVar422 = auVar392[0xc];
  bVar422 = (bVar422 < bVar436) * bVar436 | (bVar422 >= bVar436) * bVar422;
  bVar436 = auVar469[0xd];
  bVar423 = auVar392[0xd];
  bVar423 = (bVar423 < bVar436) * bVar436 | (bVar423 >= bVar436) * bVar423;
  bVar436 = auVar469[0xe];
  bVar424 = auVar392[0xe];
  bVar426 = auVar392[0xf];
  bVar424 = (bVar424 < bVar436) * bVar436 | (bVar424 >= bVar436) * bVar424;
  bVar436 = auVar469[0xf];
  bVar426 = (bVar426 < bVar436) * bVar436 | (bVar426 >= bVar436) * bVar426;
  bVar436 = -((byte)((bVar437 < bVar81) * bVar437 | (bVar437 >= bVar81) * bVar81) == bVar437) ^ 0xff
  ;
  bVar437 = -((byte)((bVar438 < bVar82) * bVar438 | (bVar438 >= bVar82) * bVar82) == bVar438) ^ 0xff
  ;
  bVar438 = -((byte)((bVar439 < bVar83) * bVar439 | (bVar439 >= bVar83) * bVar83) == bVar439) ^ 0xff
  ;
  bVar439 = -((byte)((bVar440 < bVar84) * bVar440 | (bVar440 >= bVar84) * bVar84) == bVar440) ^ 0xff
  ;
  bVar440 = -((byte)((bVar441 < bVar397) * bVar441 | (bVar441 >= bVar397) * bVar397) == bVar441) ^
            0xff;
  bVar441 = -((byte)((bVar442 < bVar400) * bVar442 | (bVar442 >= bVar400) * bVar400) == bVar442) ^
            0xff;
  bVar442 = -((byte)((bVar443 < bVar404) * bVar443 | (bVar443 >= bVar404) * bVar404) == bVar443) ^
            0xff;
  bVar443 = -((byte)((bVar155 < bVar407) * bVar155 | (bVar155 >= bVar407) * bVar407) == bVar155) ^
            0xff;
  bVar155 = -((byte)((bVar171 < bVar85) * bVar171 | (bVar171 >= bVar85) * bVar85) == bVar171) ^ 0xff
  ;
  bVar171 = -((byte)((bVar175 < bVar86) * bVar175 | (bVar175 >= bVar86) * bVar86) == bVar175) ^ 0xff
  ;
  bVar175 = -((byte)((bVar182 < bVar87) * bVar182 | (bVar182 >= bVar87) * bVar87) == bVar182) ^ 0xff
  ;
  bVar182 = -((byte)((bVar186 < bVar391) * bVar186 | (bVar186 >= bVar391) * bVar391) == bVar186) ^
            0xff;
  bVar186 = -((byte)((bVar193 < bVar410) * bVar193 | (bVar193 >= bVar410) * bVar410) == bVar193) ^
            0xff;
  bVar193 = -((byte)((bVar197 < bVar413) * bVar197 | (bVar197 >= bVar413) * bVar413) == bVar197) ^
            0xff;
  bVar197 = -((byte)((bVar204 < bVar416) * bVar204 | (bVar204 >= bVar416) * bVar416) == bVar204) ^
            0xff;
  bVar204 = -((byte)((bVar455 < bVar88) * bVar455 | (bVar455 >= bVar88) * bVar88) == bVar455) ^ 0xff
  ;
  bVar436 = (bVar436 < bVar444) * bVar444 | (bVar436 >= bVar444) * bVar436;
  bVar437 = (bVar437 < bVar448) * bVar448 | (bVar437 >= bVar448) * bVar437;
  bVar438 = (bVar438 < bVar449) * bVar449 | (bVar438 >= bVar449) * bVar438;
  bVar439 = (bVar439 < bVar450) * bVar450 | (bVar439 >= bVar450) * bVar439;
  bVar440 = (bVar440 < bVar451) * bVar451 | (bVar440 >= bVar451) * bVar440;
  bVar441 = (bVar441 < bVar452) * bVar452 | (bVar441 >= bVar452) * bVar441;
  bVar442 = (bVar442 < bVar453) * bVar453 | (bVar442 >= bVar453) * bVar442;
  bVar443 = (bVar443 < bVar454) * bVar454 | (bVar443 >= bVar454) * bVar443;
  bVar155 = (bVar155 < bVar156) * bVar156 | (bVar155 >= bVar156) * bVar155;
  bVar171 = (bVar171 < bVar172) * bVar172 | (bVar171 >= bVar172) * bVar171;
  bVar175 = (bVar175 < bVar176) * bVar176 | (bVar175 >= bVar176) * bVar175;
  bVar182 = (bVar182 < bVar183) * bVar183 | (bVar182 >= bVar183) * bVar182;
  bVar186 = (bVar186 < bVar187) * bVar187 | (bVar186 >= bVar187) * bVar186;
  bVar193 = (bVar193 < bVar194) * bVar194 | (bVar193 >= bVar194) * bVar193;
  bVar197 = (bVar197 < bVar198) * bVar198 | (bVar197 >= bVar198) * bVar197;
  bVar204 = (bVar204 < bVar205) * bVar205 | (bVar204 >= bVar205) * bVar204;
  bVar391 = (bVar390 < bVar436) * bVar436 | (bVar390 >= bVar436) * bVar390;
  bVar397 = (bVar396 < bVar437) * bVar437 | (bVar396 >= bVar437) * bVar396;
  bVar400 = (bVar399 < bVar438) * bVar438 | (bVar399 >= bVar438) * bVar399;
  bVar404 = (bVar403 < bVar439) * bVar439 | (bVar403 >= bVar439) * bVar403;
  bVar407 = (bVar406 < bVar440) * bVar440 | (bVar406 >= bVar440) * bVar406;
  bVar410 = (bVar409 < bVar441) * bVar441 | (bVar409 >= bVar441) * bVar409;
  bVar413 = (bVar412 < bVar442) * bVar442 | (bVar412 >= bVar442) * bVar412;
  bVar416 = (bVar415 < bVar443) * bVar443 | (bVar415 >= bVar443) * bVar415;
  bVar437 = (bVar418 < bVar155) * bVar155 | (bVar418 >= bVar155) * bVar418;
  bVar436 = (bVar419 < bVar171) * bVar171 | (bVar419 >= bVar171) * bVar419;
  bVar443 = (bVar420 < bVar175) * bVar175 | (bVar420 >= bVar175) * bVar420;
  bVar441 = (bVar421 < bVar182) * bVar182 | (bVar421 >= bVar182) * bVar421;
  bVar442 = (bVar422 < bVar186) * bVar186 | (bVar422 >= bVar186) * bVar422;
  bVar440 = (bVar423 < bVar193) * bVar193 | (bVar423 >= bVar193) * bVar423;
  bVar439 = (bVar424 < bVar197) * bVar197 | (bVar424 >= bVar197) * bVar424;
  bVar438 = (bVar426 < bVar204) * bVar204 | (bVar426 >= bVar204) * bVar426;
  bVar155 = *_limit0;
  bVar171 = _limit0[1];
  bVar175 = _limit0[2];
  bVar182 = _limit0[3];
  bVar186 = _limit0[4];
  bVar193 = _limit0[5];
  bVar197 = _limit0[6];
  bVar204 = _limit0[7];
  bVar455 = *_limit1;
  bVar81 = _limit1[1];
  bVar82 = _limit1[2];
  bVar83 = _limit1[3];
  bVar84 = _limit1[4];
  bVar85 = _limit1[5];
  bVar86 = _limit1[6];
  bVar87 = _limit1[7];
  bVar391 = (bVar437 < bVar391) * bVar391 | (bVar437 >= bVar391) * bVar437;
  bVar397 = (bVar436 < bVar397) * bVar397 | (bVar436 >= bVar397) * bVar436;
  bVar400 = (bVar443 < bVar400) * bVar400 | (bVar443 >= bVar400) * bVar443;
  bVar404 = (bVar441 < bVar404) * bVar404 | (bVar441 >= bVar404) * bVar441;
  bVar407 = (bVar442 < bVar407) * bVar407 | (bVar442 >= bVar407) * bVar442;
  bVar410 = (bVar440 < bVar410) * bVar410 | (bVar440 >= bVar410) * bVar440;
  bVar413 = (bVar439 < bVar413) * bVar413 | (bVar439 >= bVar413) * bVar439;
  bVar416 = (bVar438 < bVar416) * bVar416 | (bVar438 >= bVar416) * bVar438;
  bVar437 = (bVar437 != 0) * bVar437;
  bVar436 = (bVar436 != 0) * bVar436;
  bVar443 = (bVar443 != 0) * bVar443;
  bVar441 = (bVar441 != 0) * bVar441;
  bVar442 = (bVar442 != 0) * bVar442;
  bVar440 = (bVar440 != 0) * bVar440;
  bVar439 = (bVar439 != 0) * bVar439;
  bVar438 = (bVar438 != 0) * bVar438;
  auVar164[0] = -((byte)((bVar391 < bVar155) * bVar391 | (bVar391 >= bVar155) * bVar155) == bVar391)
  ;
  auVar164[1] = -((byte)((bVar397 < bVar171) * bVar397 | (bVar397 >= bVar171) * bVar171) == bVar397)
  ;
  auVar164[2] = -((byte)((bVar400 < bVar175) * bVar400 | (bVar400 >= bVar175) * bVar175) == bVar400)
  ;
  auVar164[3] = -((byte)((bVar404 < bVar182) * bVar404 | (bVar404 >= bVar182) * bVar182) == bVar404)
  ;
  auVar164[4] = -((byte)((bVar407 < bVar455) * bVar407 | (bVar407 >= bVar455) * bVar455) == bVar407)
  ;
  auVar164[5] = -((byte)((bVar410 < bVar81) * bVar410 | (bVar410 >= bVar81) * bVar81) == bVar410);
  auVar164[6] = -((byte)((bVar413 < bVar82) * bVar413 | (bVar413 >= bVar82) * bVar82) == bVar413);
  auVar164[7] = -((byte)((bVar416 < bVar83) * bVar416 | (bVar416 >= bVar83) * bVar83) == bVar416);
  auVar164[8] = -((byte)((bVar437 < bVar186) * bVar437 | (bVar437 >= bVar186) * bVar186) == bVar437)
  ;
  auVar164[9] = -((byte)((bVar436 < bVar193) * bVar436 | (bVar436 >= bVar193) * bVar193) == bVar436)
  ;
  auVar164[10] = -((byte)((bVar443 < bVar197) * bVar443 | (bVar443 >= bVar197) * bVar197) == bVar443
                  );
  auVar164[0xb] =
       -((byte)((bVar441 < bVar204) * bVar441 | (bVar441 >= bVar204) * bVar204) == bVar441);
  auVar164[0xc] = -((byte)((bVar442 < bVar84) * bVar442 | (bVar442 >= bVar84) * bVar84) == bVar442);
  auVar164[0xd] = -((byte)((bVar440 < bVar85) * bVar440 | (bVar440 >= bVar85) * bVar85) == bVar440);
  auVar164[0xe] = -((byte)((bVar439 < bVar86) * bVar439 | (bVar439 >= bVar86) * bVar86) == bVar439);
  auVar164[0xf] = -((byte)((bVar438 < bVar87) * bVar438 | (bVar438 >= bVar87) * bVar87) == bVar438);
  auVar311._8_4_ = uVar247;
  auVar311._0_8_ = uVar430;
  auVar311._12_4_ = (int)((ulong)uVar430 >> 0x20);
  auVar392 = psubsb(auVar466 ^ _DAT_004dab20,auVar262 ^ _DAT_004dab20);
  auVar161 = psubsb(~auVar311 & auVar392 >> 0x40,auVar392);
  auVar161 = psubsb(auVar161,auVar392);
  auVar392 = psubsb(auVar161,auVar392);
  auVar392 = auVar392 & auVar164;
  auVar342._0_8_ = auVar392._0_8_;
  auVar342._8_4_ = auVar392._0_4_;
  auVar342._12_4_ = auVar392._4_4_;
  auVar161 = paddsb(auVar342,_DAT_0051e8c0);
  auVar393[1] = auVar161[8];
  auVar393[0] = auVar392[8];
  auVar393[2] = auVar392[9];
  auVar393[3] = auVar161[9];
  auVar393[4] = auVar392[10];
  auVar393[5] = auVar161[10];
  auVar393[6] = auVar392[0xb];
  auVar393[7] = auVar161[0xb];
  auVar393[8] = auVar392[0xc];
  auVar393[9] = auVar161[0xc];
  auVar393[10] = auVar392[0xd];
  auVar393[0xb] = auVar161[0xd];
  auVar393[0xc] = auVar392[0xe];
  auVar393[0xd] = auVar161[0xe];
  auVar393[0xe] = auVar392[0xf];
  auVar393[0xf] = auVar161[0xf];
  auVar350._0_14_ = auVar161._0_14_;
  auVar350[0xe] = auVar161[7];
  auVar350[0xf] = auVar161[7];
  auVar349._14_2_ = auVar350._14_2_;
  auVar349._0_13_ = auVar161._0_13_;
  auVar349[0xd] = auVar161[6];
  auVar348._13_3_ = auVar349._13_3_;
  auVar348._0_12_ = auVar161._0_12_;
  auVar348[0xc] = auVar161[6];
  auVar347._12_4_ = auVar348._12_4_;
  auVar347._0_11_ = auVar161._0_11_;
  auVar347[0xb] = auVar161[5];
  auVar346._11_5_ = auVar347._11_5_;
  auVar346._0_10_ = auVar161._0_10_;
  auVar346[10] = auVar161[5];
  auVar345._10_6_ = auVar346._10_6_;
  auVar345._0_9_ = auVar161._0_9_;
  auVar345[9] = auVar161[4];
  auVar344._9_7_ = auVar345._9_7_;
  auVar344._0_8_ = auVar161._0_8_;
  auVar344[8] = auVar161[4];
  auVar343._8_8_ = auVar344._8_8_;
  auVar343[7] = auVar161[3];
  auVar343[6] = auVar161[3];
  auVar343[5] = auVar161[2];
  auVar343[4] = auVar161[2];
  auVar343[3] = auVar161[1];
  auVar343[2] = auVar161[1];
  auVar343[0] = auVar161[0];
  auVar343[1] = auVar343[0];
  auVar161 = psraw(auVar343,0xb);
  auVar392 = psraw(auVar393,0xb);
  auVar161 = packsswb(auVar161,auVar392);
  auVar394[0] = auVar161[0] + '\x01';
  cVar398 = auVar161[1] + '\x01';
  cVar401 = auVar161[2] + '\x01';
  cVar405 = auVar161[3] + '\x01';
  cVar408 = auVar161[4] + '\x01';
  cVar411 = auVar161[5] + '\x01';
  cVar414 = auVar161[6] + '\x01';
  cVar417 = auVar161[7] + '\x01';
  auVar394._8_8_ =
       (undefined8)
       (CONCAT72(CONCAT61(CONCAT51(CONCAT41(CONCAT31(CONCAT21(CONCAT11(cVar417,cVar417),cVar414),
                                                     cVar414),cVar411),cVar411),cVar408),
                 CONCAT11(cVar408,cVar417)) >> 8);
  auVar394[7] = cVar405;
  auVar394[6] = cVar405;
  auVar394[5] = cVar401;
  auVar394[4] = cVar401;
  auVar394[3] = cVar398;
  auVar394[2] = cVar398;
  auVar394[1] = auVar394[0];
  auVar392 = psraw(auVar394,9);
  auVar392 = packsswb(auVar392,auVar392);
  auVar434._8_8_ = SUB168(auVar392 & auVar311,8);
  auVar434._0_8_ = auVar161._8_8_;
  auVar351._0_8_ = auVar161._0_8_;
  auVar351._8_8_ = SUB168(auVar392 & auVar311,0);
  auVar161 = psubsb(auVar262 ^ _DAT_004dab20,auVar351);
  auVar469 = paddsb(auVar434,auVar466 ^ _DAT_004dab20);
  auVar161 = auVar161 ^ _DAT_004dab20;
  auVar469 = auVar469 ^ _DAT_004dab20;
  auVar392 = psubusb(auVar445,auVar372);
  auVar392 = auVar392 | auVar286;
  auVar446 = auVar446 | auVar370;
  bVar436 = auVar392[0];
  bVar437 = auVar446[0];
  bVar437 = (bVar437 < bVar436) * bVar436 | (bVar437 >= bVar436) * bVar437;
  bVar436 = auVar392[1];
  bVar438 = auVar446[1];
  bVar438 = (bVar438 < bVar436) * bVar436 | (bVar438 >= bVar436) * bVar438;
  bVar436 = auVar392[2];
  bVar439 = auVar446[2];
  bVar439 = (bVar439 < bVar436) * bVar436 | (bVar439 >= bVar436) * bVar439;
  bVar436 = auVar392[3];
  bVar440 = auVar446[3];
  bVar440 = (bVar440 < bVar436) * bVar436 | (bVar440 >= bVar436) * bVar440;
  bVar436 = auVar392[4];
  bVar441 = auVar446[4];
  bVar441 = (bVar441 < bVar436) * bVar436 | (bVar441 >= bVar436) * bVar441;
  bVar436 = auVar392[5];
  bVar442 = auVar446[5];
  bVar442 = (bVar442 < bVar436) * bVar436 | (bVar442 >= bVar436) * bVar442;
  bVar436 = auVar392[6];
  bVar443 = auVar446[6];
  bVar443 = (bVar443 < bVar436) * bVar436 | (bVar443 >= bVar436) * bVar443;
  bVar436 = auVar392[7];
  bVar155 = auVar446[7];
  bVar155 = (bVar155 < bVar436) * bVar436 | (bVar155 >= bVar436) * bVar155;
  bVar436 = auVar392[8];
  bVar171 = auVar446[8];
  bVar171 = (bVar171 < bVar436) * bVar436 | (bVar171 >= bVar436) * bVar171;
  bVar436 = auVar392[9];
  bVar175 = auVar446[9];
  bVar175 = (bVar175 < bVar436) * bVar436 | (bVar175 >= bVar436) * bVar175;
  bVar436 = auVar392[10];
  bVar182 = auVar446[10];
  bVar182 = (bVar182 < bVar436) * bVar436 | (bVar182 >= bVar436) * bVar182;
  bVar436 = auVar392[0xb];
  bVar186 = auVar446[0xb];
  bVar186 = (bVar186 < bVar436) * bVar436 | (bVar186 >= bVar436) * bVar186;
  bVar436 = auVar392[0xc];
  bVar193 = auVar446[0xc];
  bVar193 = (bVar193 < bVar436) * bVar436 | (bVar193 >= bVar436) * bVar193;
  bVar436 = auVar392[0xd];
  bVar197 = auVar446[0xd];
  bVar197 = (bVar197 < bVar436) * bVar436 | (bVar197 >= bVar436) * bVar197;
  bVar436 = auVar392[0xe];
  bVar204 = auVar446[0xe];
  bVar455 = auVar446[0xf];
  bVar204 = (bVar204 < bVar436) * bVar436 | (bVar204 >= bVar436) * bVar204;
  bVar436 = auVar392[0xf];
  bVar455 = (bVar455 < bVar436) * bVar436 | (bVar455 >= bVar436) * bVar455;
  bVar444 = (bVar437 < bVar444) * bVar444 | (bVar437 >= bVar444) * bVar437;
  bVar448 = (bVar438 < bVar448) * bVar448 | (bVar438 >= bVar448) * bVar438;
  bVar449 = (bVar439 < bVar449) * bVar449 | (bVar439 >= bVar449) * bVar439;
  bVar450 = (bVar440 < bVar450) * bVar450 | (bVar440 >= bVar450) * bVar440;
  bVar451 = (bVar441 < bVar451) * bVar451 | (bVar441 >= bVar451) * bVar441;
  bVar452 = (bVar442 < bVar452) * bVar452 | (bVar442 >= bVar452) * bVar442;
  bVar453 = (bVar443 < bVar453) * bVar453 | (bVar443 >= bVar453) * bVar443;
  bVar454 = (bVar155 < bVar454) * bVar454 | (bVar155 >= bVar454) * bVar155;
  bVar436 = (bVar171 < bVar156) * bVar156 | (bVar171 >= bVar156) * bVar171;
  bVar442 = (bVar175 < bVar172) * bVar172 | (bVar175 >= bVar172) * bVar175;
  bVar443 = (bVar182 < bVar176) * bVar176 | (bVar182 >= bVar176) * bVar182;
  bVar440 = (bVar186 < bVar183) * bVar183 | (bVar186 >= bVar183) * bVar186;
  bVar441 = (bVar193 < bVar187) * bVar187 | (bVar193 >= bVar187) * bVar193;
  bVar439 = (bVar197 < bVar194) * bVar194 | (bVar197 >= bVar194) * bVar197;
  bVar438 = (bVar204 < bVar198) * bVar198 | (bVar204 >= bVar198) * bVar204;
  bVar437 = (bVar455 < bVar205) * bVar205 | (bVar455 >= bVar205) * bVar455;
  bVar444 = (bVar436 < bVar444) * bVar444 | (bVar436 >= bVar444) * bVar436;
  bVar448 = (bVar442 < bVar448) * bVar448 | (bVar442 >= bVar448) * bVar442;
  bVar449 = (bVar443 < bVar449) * bVar449 | (bVar443 >= bVar449) * bVar443;
  bVar450 = (bVar440 < bVar450) * bVar450 | (bVar440 >= bVar450) * bVar440;
  bVar451 = (bVar441 < bVar451) * bVar451 | (bVar441 >= bVar451) * bVar441;
  bVar452 = (bVar439 < bVar452) * bVar452 | (bVar439 >= bVar452) * bVar439;
  bVar453 = (bVar438 < bVar453) * bVar453 | (bVar438 >= bVar453) * bVar438;
  bVar454 = (bVar437 < bVar454) * bVar454 | (bVar437 >= bVar454) * bVar437;
  bVar436 = (bVar436 != 0) * bVar436;
  bVar442 = (bVar442 != 0) * bVar442;
  bVar443 = (bVar443 != 0) * bVar443;
  bVar440 = (bVar440 != 0) * bVar440;
  bVar441 = (bVar441 != 0) * bVar441;
  bVar439 = (bVar439 != 0) * bVar439;
  bVar438 = (bVar438 != 0) * bVar438;
  bVar437 = (bVar437 != 0) * bVar437;
  auVar352[0] = -((byte)((bVar444 == 0) * bVar444 | bVar444 != 0) == bVar444);
  auVar352[1] = -((byte)((bVar448 == 0) * bVar448 | bVar448 != 0) == bVar448);
  auVar352[2] = -((byte)((bVar449 == 0) * bVar449 | bVar449 != 0) == bVar449);
  auVar352[3] = -((byte)((bVar450 == 0) * bVar450 | bVar450 != 0) == bVar450);
  auVar352[4] = -((byte)((bVar451 == 0) * bVar451 | bVar451 != 0) == bVar451);
  auVar352[5] = -((byte)((bVar452 == 0) * bVar452 | bVar452 != 0) == bVar452);
  auVar352[6] = -((byte)((bVar453 == 0) * bVar453 | bVar453 != 0) == bVar453);
  auVar352[7] = -((byte)((bVar454 == 0) * bVar454 | bVar454 != 0) == bVar454);
  auVar352[8] = -((byte)((bVar436 == 0) * bVar436 | bVar436 != 0) == bVar436);
  auVar352[9] = -((byte)((bVar442 == 0) * bVar442 | bVar442 != 0) == bVar442);
  auVar352[10] = -((byte)((bVar443 == 0) * bVar443 | bVar443 != 0) == bVar443);
  auVar352[0xb] = -((byte)((bVar440 == 0) * bVar440 | bVar440 != 0) == bVar440);
  auVar352[0xc] = -((byte)((bVar441 == 0) * bVar441 | bVar441 != 0) == bVar441);
  auVar352[0xd] = -((byte)((bVar439 == 0) * bVar439 | bVar439 != 0) == bVar439);
  auVar352[0xe] = -((byte)((bVar438 == 0) * bVar438 | bVar438 != 0) == bVar438);
  auVar352[0xf] = -((byte)((bVar437 == 0) * bVar437 | bVar437 != 0) == bVar437);
  auVar352 = auVar352 & auVar164;
  auVar447._0_8_ = auVar352._0_8_;
  auVar447._8_4_ = auVar352._0_4_;
  auVar447._12_4_ = auVar352._4_4_;
  auVar165[0] = -(auVar352[0] == '\0');
  auVar165[1] = -(auVar352[1] == '\0');
  auVar165[2] = -(auVar352[2] == '\0');
  auVar165[3] = -(auVar352[3] == '\0');
  auVar165[4] = -(auVar352[4] == '\0');
  auVar165[5] = -(auVar352[5] == '\0');
  auVar165[6] = -(auVar352[6] == '\0');
  auVar165[7] = -(auVar352[7] == '\0');
  auVar165[8] = -(auVar352[0] == '\0');
  auVar165[9] = -(auVar352[1] == '\0');
  auVar165[10] = -(auVar352[2] == '\0');
  auVar165[0xb] = -(auVar352[3] == '\0');
  auVar165[0xc] = -(auVar352[4] == '\0');
  auVar165[0xd] = -(auVar352[5] == '\0');
  auVar165[0xe] = -(auVar352[6] == '\0');
  auVar165[0xf] = -(auVar352[7] == '\0');
  if ((ushort)((ushort)(SUB161(auVar165 >> 7,0) & 1) | (ushort)(SUB161(auVar165 >> 0xf,0) & 1) << 1
               | (ushort)(SUB161(auVar165 >> 0x17,0) & 1) << 2 |
               (ushort)(SUB161(auVar165 >> 0x1f,0) & 1) << 3 |
               (ushort)(SUB161(auVar165 >> 0x27,0) & 1) << 4 |
               (ushort)(SUB161(auVar165 >> 0x2f,0) & 1) << 5 |
               (ushort)(SUB161(auVar165 >> 0x37,0) & 1) << 6 |
               (ushort)(SUB161(auVar165 >> 0x3f,0) & 1) << 7 |
               (ushort)(SUB161(auVar165 >> 0x47,0) & 1) << 8 |
               (ushort)(SUB161(auVar165 >> 0x4f,0) & 1) << 9 |
               (ushort)(SUB161(auVar165 >> 0x57,0) & 1) << 10 |
               (ushort)(SUB161(auVar165 >> 0x5f,0) & 1) << 0xb |
               (ushort)(SUB161(auVar165 >> 0x67,0) & 1) << 0xc |
               (ushort)(SUB161(auVar165 >> 0x6f,0) & 1) << 0xd |
               (ushort)(SUB161(auVar165 >> 0x77,0) & 1) << 0xe | (ushort)(auVar165[0xf] >> 7) << 0xf
              ) == 0xffff) {
    auVar90._8_8_ = uVar362;
    auVar90._0_8_ = uVar338;
    auVar340 = auVar90._0_14_;
  }
  else {
    auVar7._8_6_ = 0;
    auVar7._0_8_ = uVar362;
    auVar7[0xe] = uVar312;
    auVar17._8_4_ = 0;
    auVar17._0_8_ = uVar362;
    auVar17[0xc] = uVar293;
    auVar17._13_2_ = auVar7._13_2_;
    auVar27._8_4_ = 0;
    auVar27._0_8_ = uVar362;
    auVar27._12_3_ = auVar17._12_3_;
    auVar37._8_2_ = 0;
    auVar37._0_8_ = uVar362;
    auVar37[10] = uVar292;
    auVar37._11_4_ = auVar27._11_4_;
    auVar47._8_2_ = 0;
    auVar47._0_8_ = uVar362;
    auVar47._10_5_ = auVar37._10_5_;
    auVar57[8] = uVar266;
    auVar57._0_8_ = uVar362;
    auVar57._9_6_ = auVar47._9_6_;
    auVar104._7_8_ = 0;
    auVar104._0_7_ = auVar57._8_7_;
    Var105 = CONCAT81(SUB158(auVar104 << 0x40,7),uVar265);
    auVar136._9_6_ = 0;
    auVar136._0_9_ = Var105;
    auVar106._1_10_ = SUB1510(auVar136 << 0x30,5);
    auVar106[0] = uVar170;
    auVar137._11_4_ = 0;
    auVar137._0_11_ = auVar106;
    auVar71[2] = uVar169;
    auVar71._0_2_ = uVar243;
    auVar71._3_12_ = SUB1512(auVar137 << 0x20,3);
    uVar243 = uVar243 & 0xff;
    auVar8[0xd] = 0;
    auVar8._0_13_ = auVar369._0_13_;
    auVar8[0xe] = uVar313;
    auVar18[0xc] = uVar295;
    auVar18._0_12_ = auVar364;
    auVar18._13_2_ = auVar8._13_2_;
    auVar28[0xb] = 0;
    auVar28._0_11_ = auVar364._0_11_;
    auVar28._12_3_ = auVar18._12_3_;
    auVar38[10] = uVar294;
    auVar38._0_10_ = auVar364._0_10_;
    auVar38._11_4_ = auVar28._11_4_;
    auVar48[9] = 0;
    auVar48._0_9_ = auVar364._0_9_;
    auVar48._10_5_ = auVar38._10_5_;
    auVar58[8] = uVar268;
    auVar58._0_8_ = auVar364._0_8_;
    auVar58._9_6_ = auVar48._9_6_;
    auVar107._7_8_ = 0;
    auVar107._0_7_ = auVar58._8_7_;
    Var108 = CONCAT81(SUB158(auVar107 << 0x40,7),uVar267);
    auVar138._9_6_ = 0;
    auVar138._0_9_ = Var108;
    auVar109._1_10_ = SUB1510(auVar138 << 0x30,5);
    auVar109[0] = uVar174;
    auVar139._11_4_ = 0;
    auVar139._0_11_ = auVar109;
    auVar72[2] = uVar173;
    auVar72._0_2_ = uVar241;
    auVar72._3_12_ = SUB1512(auVar139 << 0x20,3);
    uVar241 = uVar241 & 0xff;
    auVar9._8_6_ = 0;
    auVar9._0_8_ = auVar445._0_8_;
    auVar9[0xe] = uVar317;
    auVar19._8_4_ = 0;
    auVar19._0_8_ = auVar445._0_8_;
    auVar19[0xc] = uVar297;
    auVar19._13_2_ = auVar9._13_2_;
    auVar29._8_4_ = 0;
    auVar29._0_8_ = auVar445._0_8_;
    auVar29._12_3_ = auVar19._12_3_;
    auVar39._8_2_ = 0;
    auVar39._0_8_ = auVar445._0_8_;
    auVar39[10] = uVar296;
    auVar39._11_4_ = auVar29._11_4_;
    auVar49._8_2_ = 0;
    auVar49._0_8_ = auVar445._0_8_;
    auVar49._10_5_ = auVar39._10_5_;
    auVar59[8] = uVar270;
    auVar59._0_8_ = auVar445._0_8_;
    auVar59._9_6_ = auVar49._9_6_;
    auVar110._7_8_ = 0;
    auVar110._0_7_ = auVar59._8_7_;
    Var111 = CONCAT81(SUB158(auVar110 << 0x40,7),uVar269);
    auVar140._9_6_ = 0;
    auVar140._0_9_ = Var111;
    auVar112._1_10_ = SUB1510(auVar140 << 0x30,5);
    auVar112[0] = uVar181;
    auVar141._11_4_ = 0;
    auVar141._0_11_ = auVar112;
    auVar73[2] = uVar180;
    auVar73._0_2_ = uVar381;
    auVar73._3_12_ = SUB1512(auVar141 << 0x20,3);
    auVar10[0xd] = 0;
    auVar10._0_13_ = auVar456._0_13_;
    auVar10[0xe] = uVar318;
    auVar20[0xc] = uVar299;
    auVar20._0_12_ = auVar456._0_12_;
    auVar20._13_2_ = auVar10._13_2_;
    auVar30[0xb] = 0;
    auVar30._0_11_ = auVar456._0_11_;
    auVar30._12_3_ = auVar20._12_3_;
    auVar40[10] = uVar298;
    auVar40._0_10_ = auVar456._0_10_;
    auVar40._11_4_ = auVar30._11_4_;
    auVar50[9] = 0;
    auVar50._0_9_ = auVar456._0_9_;
    auVar50._10_5_ = auVar40._10_5_;
    auVar60[8] = uVar272;
    auVar60._0_8_ = auVar456._0_8_;
    auVar60._9_6_ = auVar50._9_6_;
    auVar113._7_8_ = 0;
    auVar113._0_7_ = auVar60._8_7_;
    Var114 = CONCAT81(SUB158(auVar113 << 0x40,7),uVar271);
    auVar142._9_6_ = 0;
    auVar142._0_9_ = Var114;
    auVar67[4] = uVar185;
    auVar67._0_4_ = uVar218;
    auVar67._5_10_ = SUB1510(auVar142 << 0x30,5);
    auVar115._11_4_ = 0;
    auVar115._0_11_ = auVar67._4_11_;
    auVar74[2] = uVar184;
    auVar74._0_2_ = uVar217;
    auVar74._3_12_ = SUB1512(auVar115 << 0x20,3);
    uVar217 = uVar217 & 0xff;
    auVar11._8_6_ = 0;
    auVar11._0_8_ = auVar456._8_8_;
    auVar11[0xe] = uVar322;
    auVar21._8_4_ = 0;
    auVar21._0_8_ = auVar456._8_8_;
    auVar21[0xc] = uVar301;
    auVar21._13_2_ = auVar11._13_2_;
    auVar31._8_4_ = 0;
    auVar31._0_8_ = auVar456._8_8_;
    auVar31._12_3_ = auVar21._12_3_;
    auVar41._8_2_ = 0;
    auVar41._0_8_ = auVar456._8_8_;
    auVar41[10] = uVar300;
    auVar41._11_4_ = auVar31._11_4_;
    auVar51._8_2_ = 0;
    auVar51._0_8_ = auVar456._8_8_;
    auVar51._10_5_ = auVar41._10_5_;
    auVar61[8] = uVar274;
    auVar61._0_8_ = auVar456._8_8_;
    auVar61._9_6_ = auVar51._9_6_;
    auVar116._7_8_ = 0;
    auVar116._0_7_ = auVar61._8_7_;
    Var117 = CONCAT81(SUB158(auVar116 << 0x40,7),uVar273);
    auVar143._9_6_ = 0;
    auVar143._0_9_ = Var117;
    auVar118._1_10_ = SUB1510(auVar143 << 0x30,5);
    auVar118[0] = uVar192;
    auVar144._11_4_ = 0;
    auVar144._0_11_ = auVar118;
    auVar75[2] = uVar191;
    auVar75._0_2_ = uVar465;
    auVar75._3_12_ = SUB1512(auVar144 << 0x20,3);
    auVar12[0xd] = 0;
    auVar12._0_13_ = auVar231._0_13_;
    auVar12[0xe] = uVar323;
    auVar22[0xc] = uVar303;
    auVar22._0_12_ = auVar220;
    auVar22._13_2_ = auVar12._13_2_;
    auVar32[0xb] = 0;
    auVar32._0_11_ = auVar220._0_11_;
    auVar32._12_3_ = auVar22._12_3_;
    auVar42[10] = uVar302;
    auVar42._0_10_ = auVar220._0_10_;
    auVar42._11_4_ = auVar32._11_4_;
    auVar52[9] = 0;
    auVar52._0_9_ = auVar220._0_9_;
    auVar52._10_5_ = auVar42._10_5_;
    auVar62[8] = uVar276;
    auVar62._0_8_ = auVar220._0_8_;
    auVar62._9_6_ = auVar52._9_6_;
    auVar119._7_8_ = 0;
    auVar119._0_7_ = auVar62._8_7_;
    Var120 = CONCAT81(SUB158(auVar119 << 0x40,7),uVar275);
    auVar145._9_6_ = 0;
    auVar145._0_9_ = Var120;
    auVar68[4] = uVar196;
    auVar68._0_4_ = auVar219._8_4_;
    auVar68._5_10_ = SUB1510(auVar145 << 0x30,5);
    auVar121._11_4_ = 0;
    auVar121._0_11_ = auVar68._4_11_;
    auVar76[2] = uVar195;
    auVar76._0_2_ = uVar239;
    auVar76._3_12_ = SUB1512(auVar121 << 0x20,3);
    auVar89._8_8_ = uVar362;
    auVar89._0_8_ = uVar338;
    auVar340 = auVar89._0_14_;
    auVar13[0xd] = 0;
    auVar13._0_13_ = auVar89._0_13_;
    auVar13[0xe] = (char)uVar6;
    auVar23[0xc] = (char)uVar5;
    auVar23._0_12_ = auVar89._0_12_;
    auVar23._13_2_ = auVar13._13_2_;
    auVar33[0xb] = 0;
    auVar33._0_11_ = auVar89._0_11_;
    auVar33._12_3_ = auVar23._12_3_;
    auVar43[10] = (char)uVar4;
    auVar43._0_10_ = auVar89._0_10_;
    auVar43._11_4_ = auVar33._11_4_;
    auVar53[9] = 0;
    auVar53._0_9_ = auVar89._0_9_;
    auVar53._10_5_ = auVar43._10_5_;
    auVar63[8] = (char)uVar3;
    auVar63._0_8_ = uVar338;
    auVar63._9_6_ = auVar53._9_6_;
    auVar122._7_8_ = 0;
    auVar122._0_7_ = auVar63._8_7_;
    Var123 = CONCAT81(SUB158(auVar122 << 0x40,7),(char)uVar431);
    auVar146._9_6_ = 0;
    auVar146._0_9_ = Var123;
    auVar124._1_10_ = SUB1510(auVar146 << 0x30,5);
    auVar124[0] = (char)uVar2;
    auVar147._11_4_ = 0;
    auVar147._0_11_ = auVar124;
    auVar77[2] = (char)uVar159;
    auVar77._0_2_ = auVar222._0_2_;
    auVar77._3_12_ = SUB1512(auVar147 << 0x20,3);
    uVar402 = (ushort)(byte)uVar1;
    sVar177 = auVar77._2_2_;
    sVar188 = auVar124._0_2_;
    sVar199 = (short)Var123;
    sVar206 = auVar63._8_2_;
    sVar209 = auVar43._10_2_;
    sVar212 = auVar23._12_2_;
    uVar244 = auVar13._13_2_ >> 8;
    sVar314 = auVar72._2_2_;
    sVar470 = auVar71._2_2_;
    sVar319 = auVar109._0_2_;
    sVar471 = auVar106._0_2_;
    sVar324 = (short)Var108;
    sVar472 = (short)Var105;
    sVar328 = auVar58._8_2_;
    sVar473 = auVar57._8_2_;
    sVar331 = auVar38._10_2_;
    sVar474 = auVar37._10_2_;
    sVar334 = auVar18._12_2_;
    uVar69 = auVar8._13_2_ >> 8;
    sVar475 = auVar17._12_2_;
    uVar245 = auVar7._13_2_ >> 8;
    sVar316 = (short)Var111;
    uVar389 = auVar9._13_2_ >> 8;
    sVar157 = uVar402 * 2 + (uVar381 & 0xff) + uVar241 + uVar243 + 4;
    sVar178 = sVar177 * 2 + auVar73._2_2_ + sVar314 + sVar470 + 4;
    sVar189 = sVar188 * 2 + auVar112._0_2_ + sVar319 + sVar471 + 4;
    sVar200 = sVar199 * 2 + sVar316 + sVar324 + sVar472 + 4;
    sVar207 = sVar206 * 2 + auVar59._8_2_ + sVar328 + sVar473 + 4;
    sVar210 = sVar209 * 2 + auVar39._10_2_ + sVar331 + sVar474 + 4;
    sVar213 = sVar212 * 2 + auVar19._12_2_ + sVar334 + sVar475 + 4;
    sVar215 = uVar244 * 2 + uVar389 + uVar69 + uVar245 + 4;
    sVar459 = auVar74._2_2_;
    sVar460 = auVar67._4_2_;
    sVar461 = (short)Var114;
    sVar462 = auVar60._8_2_;
    sVar463 = auVar40._10_2_;
    sVar464 = auVar20._12_2_;
    uVar425 = auVar10._13_2_ >> 8;
    sVar363 = (uVar465 & 0xff) + uVar217;
    sVar373 = auVar75._2_2_ + sVar459;
    sVar374 = auVar118._0_2_ + sVar460;
    sVar376 = (short)Var117;
    sVar375 = sVar376 + sVar461;
    sVar377 = auVar61._8_2_ + sVar462;
    sVar378 = auVar41._10_2_ + sVar463;
    uVar467 = auVar11._13_2_ >> 8;
    sVar379 = auVar21._12_2_ + sVar464;
    sVar380 = uVar467 + uVar425;
    uVar306 = (ushort)(sVar363 + uVar241 + sVar157) >> 3;
    uVar315 = (ushort)(sVar373 + sVar314 + sVar178) >> 3;
    uVar320 = (ushort)(sVar374 + sVar319 + sVar189) >> 3;
    uVar325 = (ushort)(sVar375 + sVar324 + sVar200) >> 3;
    uVar329 = (ushort)(sVar377 + sVar328 + sVar207) >> 3;
    uVar332 = (ushort)(sVar378 + sVar331 + sVar210) >> 3;
    uVar335 = (ushort)(sVar379 + sVar334 + sVar213) >> 3;
    uVar337 = (ushort)(sVar380 + uVar69 + sVar215) >> 3;
    sVar158 = (sVar157 - uVar402) + (uVar239 & 0xff);
    sVar179 = (sVar178 - sVar177) + auVar76._2_2_;
    sVar190 = (sVar189 - sVar188) + auVar68._4_2_;
    sVar240 = (short)Var120;
    sVar201 = (sVar200 - sVar199) + sVar240;
    sVar208 = (sVar207 - sVar206) + auVar62._8_2_;
    sVar211 = (sVar210 - sVar209) + auVar42._10_2_;
    sVar214 = (sVar213 - sVar212) + auVar22._12_2_;
    uVar70 = auVar12._13_2_ >> 8;
    sVar216 = (sVar215 - uVar244) + uVar70;
    uVar381 = (ushort)((uVar381 & 0xff) + sVar363 + sVar158) >> 3;
    uVar383 = (ushort)(auVar73._2_2_ + sVar373 + sVar179) >> 3;
    uVar384 = (ushort)(auVar112._0_2_ + sVar374 + sVar190) >> 3;
    uVar385 = (ushort)(sVar316 + sVar375 + sVar201) >> 3;
    uVar386 = (ushort)(auVar59._8_2_ + sVar377 + sVar208) >> 3;
    uVar387 = (ushort)(auVar39._10_2_ + sVar378 + sVar211) >> 3;
    uVar388 = (ushort)(auVar19._12_2_ + sVar379 + sVar214) >> 3;
    uVar389 = (ushort)(uVar389 + sVar380 + sVar216) >> 3;
    auVar382[1] = (uVar383 != 0) * (uVar383 < 0x100) * (char)uVar383 - (0xff < uVar383);
    auVar382[0] = (uVar381 != 0) * (uVar381 < 0x100) * (char)uVar381 - (0xff < uVar381);
    auVar382[2] = (uVar384 != 0) * (uVar384 < 0x100) * (char)uVar384 - (0xff < uVar384);
    auVar382[3] = (uVar385 != 0) * (uVar385 < 0x100) * (char)uVar385 - (0xff < uVar385);
    auVar382[4] = (uVar386 != 0) * (uVar386 < 0x100) * (char)uVar386 - (0xff < uVar386);
    auVar382[5] = (uVar387 != 0) * (uVar387 < 0x100) * (char)uVar387 - (0xff < uVar387);
    auVar382[6] = (uVar388 != 0) * (uVar388 < 0x100) * (char)uVar388 - (0xff < uVar388);
    auVar382[7] = (uVar389 != 0) * (uVar389 < 0x100) * (char)uVar389 - (0xff < uVar389);
    auVar382[8] = (uVar306 != 0) * (uVar306 < 0x100) * (char)uVar306 - (0xff < uVar306);
    auVar382[9] = (uVar315 != 0) * (uVar315 < 0x100) * (char)uVar315 - (0xff < uVar315);
    auVar382[10] = (uVar320 != 0) * (uVar320 < 0x100) * (char)uVar320 - (0xff < uVar320);
    auVar382[0xb] = (uVar325 != 0) * (uVar325 < 0x100) * (char)uVar325 - (0xff < uVar325);
    auVar382[0xc] = (uVar329 != 0) * (uVar329 < 0x100) * (char)uVar329 - (0xff < uVar329);
    auVar382[0xd] = (uVar332 != 0) * (uVar332 < 0x100) * (char)uVar332 - (0xff < uVar332);
    auVar382[0xe] = (uVar335 != 0) * (uVar335 < 0x100) * (char)uVar335 - (0xff < uVar335);
    auVar382[0xf] = (uVar337 != 0) * (uVar337 < 0x100) * (char)uVar337 - (0xff < uVar337);
    auVar14._8_6_ = 0;
    auVar14._0_8_ = uVar307;
    auVar14[0xe] = uVar327;
    auVar24._8_4_ = 0;
    auVar24._0_8_ = uVar307;
    auVar24[0xc] = uVar305;
    auVar24._13_2_ = auVar14._13_2_;
    auVar34._8_4_ = 0;
    auVar34._0_8_ = uVar307;
    auVar34._12_3_ = auVar24._12_3_;
    auVar44._8_2_ = 0;
    auVar44._0_8_ = uVar307;
    auVar44[10] = uVar304;
    auVar44._11_4_ = auVar34._11_4_;
    auVar54._8_2_ = 0;
    auVar54._0_8_ = uVar307;
    auVar54._10_5_ = auVar44._10_5_;
    auVar64[8] = uVar278;
    auVar64._0_8_ = uVar307;
    auVar64._9_6_ = auVar54._9_6_;
    auVar125._7_8_ = 0;
    auVar125._0_7_ = auVar64._8_7_;
    Var105 = CONCAT81(SUB158(auVar125 << 0x40,7),uVar277);
    auVar148._9_6_ = 0;
    auVar148._0_9_ = Var105;
    auVar126._1_10_ = SUB1510(auVar148 << 0x30,5);
    auVar126[0] = uVar203;
    auVar149._11_4_ = 0;
    auVar149._0_11_ = auVar126;
    auVar78[2] = uVar202;
    auVar78._0_2_ = auVar228._14_2_;
    auVar78._3_12_ = SUB1512(auVar149 << 0x20,3);
    uVar389 = auVar228._14_2_ & 0xff;
    sVar158 = (sVar158 - uVar402) + uVar389;
    sVar316 = auVar78._2_2_;
    sVar179 = (sVar179 - sVar177) + sVar316;
    sVar321 = auVar126._0_2_;
    sVar190 = (sVar190 - sVar188) + sVar321;
    sVar326 = (short)Var105;
    sVar201 = (sVar201 - sVar199) + sVar326;
    sVar330 = auVar64._8_2_;
    sVar208 = (sVar208 - sVar206) + sVar330;
    sVar333 = auVar44._10_2_;
    sVar211 = (sVar211 - sVar209) + sVar333;
    sVar336 = auVar24._12_2_;
    sVar214 = (sVar214 - sVar212) + sVar336;
    uVar381 = auVar14._13_2_ >> 8;
    sVar216 = (sVar216 - uVar244) + uVar381;
    uVar306 = (ushort)(uVar217 + sVar363 + sVar158) >> 3;
    uVar315 = (ushort)(sVar459 + sVar373 + sVar179) >> 3;
    uVar320 = (ushort)(sVar460 + sVar374 + sVar190) >> 3;
    uVar325 = (ushort)(sVar461 + sVar375 + sVar201) >> 3;
    uVar329 = (ushort)(sVar462 + sVar377 + sVar208) >> 3;
    uVar332 = (ushort)(sVar463 + sVar378 + sVar211) >> 3;
    uVar335 = (ushort)(sVar464 + sVar379 + sVar214) >> 3;
    uVar337 = (ushort)(uVar425 + sVar380 + sVar216) >> 3;
    sVar158 = (sVar158 - uVar243) + uVar389;
    sVar179 = (sVar179 - sVar470) + sVar316;
    sVar190 = (sVar190 - sVar471) + sVar321;
    sVar201 = (sVar201 - sVar472) + sVar326;
    sVar208 = (sVar208 - sVar473) + sVar330;
    sVar211 = (sVar211 - sVar474) + sVar333;
    sVar214 = (sVar214 - sVar475) + sVar336;
    sVar216 = (sVar216 - uVar245) + uVar381;
    uVar465 = (ushort)((uVar465 & 0xff) + sVar363 + sVar158) >> 3;
    uVar383 = (ushort)(auVar75._2_2_ + sVar373 + sVar179) >> 3;
    uVar384 = (ushort)(auVar118._0_2_ + sVar374 + sVar190) >> 3;
    uVar385 = (ushort)(sVar376 + sVar375 + sVar201) >> 3;
    uVar386 = (ushort)(auVar61._8_2_ + sVar377 + sVar208) >> 3;
    uVar387 = (ushort)(auVar41._10_2_ + sVar378 + sVar211) >> 3;
    uVar388 = (ushort)(auVar21._12_2_ + sVar379 + sVar214) >> 3;
    uVar467 = (ushort)(uVar467 + sVar380 + sVar216) >> 3;
    auVar458[1] = (uVar315 != 0) * (uVar315 < 0x100) * (char)uVar315 - (0xff < uVar315);
    auVar458[0] = (uVar306 != 0) * (uVar306 < 0x100) * (char)uVar306 - (0xff < uVar306);
    auVar458[2] = (uVar320 != 0) * (uVar320 < 0x100) * (char)uVar320 - (0xff < uVar320);
    auVar458[3] = (uVar325 != 0) * (uVar325 < 0x100) * (char)uVar325 - (0xff < uVar325);
    auVar458[4] = (uVar329 != 0) * (uVar329 < 0x100) * (char)uVar329 - (0xff < uVar329);
    auVar458[5] = (uVar332 != 0) * (uVar332 < 0x100) * (char)uVar332 - (0xff < uVar332);
    auVar458[6] = (uVar335 != 0) * (uVar335 < 0x100) * (char)uVar335 - (0xff < uVar335);
    auVar458[7] = (uVar337 != 0) * (uVar337 < 0x100) * (char)uVar337 - (0xff < uVar337);
    auVar458[8] = (uVar465 != 0) * (uVar465 < 0x100) * (char)uVar465 - (0xff < uVar465);
    auVar458[9] = (uVar383 != 0) * (uVar383 < 0x100) * (char)uVar383 - (0xff < uVar383);
    auVar458[10] = (uVar384 != 0) * (uVar384 < 0x100) * (char)uVar384 - (0xff < uVar384);
    auVar458[0xb] = (uVar385 != 0) * (uVar385 < 0x100) * (char)uVar385 - (0xff < uVar385);
    auVar458[0xc] = (uVar386 != 0) * (uVar386 < 0x100) * (char)uVar386 - (0xff < uVar386);
    auVar458[0xd] = (uVar387 != 0) * (uVar387 < 0x100) * (char)uVar387 - (0xff < uVar387);
    auVar458[0xe] = (uVar388 != 0) * (uVar388 < 0x100) * (char)uVar388 - (0xff < uVar388);
    auVar458[0xf] = (uVar467 != 0) * (uVar467 < 0x100) * (char)uVar467 - (0xff < uVar467);
    uVar467 = (ushort)(uVar402 + uVar217 + uVar243 + sVar157) >> 3;
    uVar402 = (ushort)(sVar177 + sVar459 + sVar470 + sVar178) >> 3;
    uVar306 = (ushort)(sVar188 + sVar460 + sVar471 + sVar189) >> 3;
    uVar315 = (ushort)(sVar199 + sVar461 + sVar472 + sVar200) >> 3;
    uVar320 = (ushort)(sVar206 + sVar462 + sVar473 + sVar207) >> 3;
    uVar325 = (ushort)(sVar209 + sVar463 + sVar474 + sVar210) >> 3;
    uVar329 = (ushort)(sVar212 + sVar464 + sVar475 + sVar213) >> 3;
    uVar425 = (ushort)(uVar244 + uVar425 + uVar245 + sVar215) >> 3;
    uVar217 = (ushort)(((uVar239 & 0xff) - uVar241) + uVar389 + sVar363 + sVar158) >> 3;
    uVar465 = (ushort)((auVar76._2_2_ - sVar314) + sVar316 + sVar373 + sVar179) >> 3;
    uVar239 = (ushort)((auVar68._4_2_ - sVar319) + sVar321 + sVar374 + sVar190) >> 3;
    uVar241 = (ushort)((sVar240 - sVar324) + sVar326 + sVar375 + sVar201) >> 3;
    uVar243 = (ushort)((auVar62._8_2_ - sVar328) + sVar330 + sVar377 + sVar208) >> 3;
    uVar244 = (ushort)((auVar42._10_2_ - sVar331) + sVar333 + sVar378 + sVar211) >> 3;
    uVar245 = (ushort)((auVar22._12_2_ - sVar334) + sVar336 + sVar379 + sVar214) >> 3;
    uVar381 = (ushort)((uVar70 - uVar69) + uVar381 + sVar380 + sVar216) >> 3;
    auVar395[1] = (uVar402 != 0) * (uVar402 < 0x100) * (char)uVar402 - (0xff < uVar402);
    auVar395[0] = (uVar467 != 0) * (uVar467 < 0x100) * (char)uVar467 - (0xff < uVar467);
    auVar395[2] = (uVar306 != 0) * (uVar306 < 0x100) * (char)uVar306 - (0xff < uVar306);
    auVar395[3] = (uVar315 != 0) * (uVar315 < 0x100) * (char)uVar315 - (0xff < uVar315);
    auVar395[4] = (uVar320 != 0) * (uVar320 < 0x100) * (char)uVar320 - (0xff < uVar320);
    auVar395[5] = (uVar325 != 0) * (uVar325 < 0x100) * (char)uVar325 - (0xff < uVar325);
    auVar395[6] = (uVar329 != 0) * (uVar329 < 0x100) * (char)uVar329 - (0xff < uVar329);
    auVar395[7] = (uVar425 != 0) * (uVar425 < 0x100) * (char)uVar425 - (0xff < uVar425);
    auVar395[8] = (uVar217 != 0) * (uVar217 < 0x100) * (char)uVar217 - (0xff < uVar217);
    auVar395[9] = (uVar465 != 0) * (uVar465 < 0x100) * (char)uVar465 - (0xff < uVar465);
    auVar395[10] = (uVar239 != 0) * (uVar239 < 0x100) * (char)uVar239 - (0xff < uVar239);
    auVar395[0xb] = (uVar241 != 0) * (uVar241 < 0x100) * (char)uVar241 - (0xff < uVar241);
    auVar395[0xc] = (uVar243 != 0) * (uVar243 < 0x100) * (char)uVar243 - (0xff < uVar243);
    auVar395[0xd] = (uVar244 != 0) * (uVar244 < 0x100) * (char)uVar244 - (0xff < uVar244);
    auVar395[0xe] = (uVar245 != 0) * (uVar245 < 0x100) * (char)uVar245 - (0xff < uVar245);
    auVar395[0xf] = (uVar381 != 0) * (uVar381 < 0x100) * (char)uVar381 - (0xff < uVar381);
    auVar286 = auVar395 & auVar447 | ~auVar447 & auVar372;
    uVar362 = auVar286._0_8_;
    auVar161 = auVar458 & auVar447 | ~auVar447 & auVar161;
    auVar469 = auVar382 & auVar447 | ~auVar447 & auVar469;
    auVar221._8_6_ = 0;
    auVar221._0_8_ = auVar286._8_8_;
  }
  auVar360[0xe] = auVar340[7];
  auVar360._0_14_ = auVar340;
  auVar360[0xf] = (char)(uVar362 >> 0x38);
  auVar359._14_2_ = auVar360._14_2_;
  auVar359._0_13_ = auVar340._0_13_;
  auVar359[0xd] = (char)(uVar362 >> 0x30);
  auVar358._13_3_ = auVar359._13_3_;
  auVar358._0_12_ = auVar340._0_12_;
  auVar358[0xc] = auVar340[6];
  auVar357._12_4_ = auVar358._12_4_;
  auVar357._0_11_ = auVar340._0_11_;
  auVar357[0xb] = (char)(uVar362 >> 0x28);
  auVar356._11_5_ = auVar357._11_5_;
  auVar356._0_10_ = auVar340._0_10_;
  auVar356[10] = auVar340[5];
  auVar355._10_6_ = auVar356._10_6_;
  auVar355._0_9_ = auVar340._0_9_;
  auVar355[9] = (char)(uVar362 >> 0x20);
  auVar354._9_7_ = auVar355._9_7_;
  auVar354._0_8_ = auVar340._0_8_;
  auVar354[8] = auVar340[4];
  Var92 = CONCAT91(CONCAT81(auVar354._8_8_,(char)(uVar362 >> 0x18)),auVar340[3]);
  auVar128._2_10_ = Var92;
  auVar128[1] = (char)(uVar362 >> 0x10);
  auVar128[0] = auVar340[2];
  auVar127._2_12_ = auVar128;
  auVar127[1] = (char)(uVar362 >> 8);
  auVar127[0] = auVar340[1];
  auVar353._0_2_ = CONCAT11((char)uVar362,auVar340[0]);
  auVar353._2_14_ = auVar127;
  bVar436 = auVar469[7];
  auVar15[0xd] = 0;
  auVar15._0_13_ = auVar469._0_13_;
  auVar15[0xe] = bVar436;
  auVar25[0xc] = auVar469[6];
  auVar25._0_12_ = auVar469._0_12_;
  auVar25._13_2_ = auVar15._13_2_;
  auVar35[0xb] = 0;
  auVar35._0_11_ = auVar469._0_11_;
  auVar35._12_3_ = auVar25._12_3_;
  auVar45[10] = auVar469[5];
  auVar45._0_10_ = auVar469._0_10_;
  auVar45._11_4_ = auVar35._11_4_;
  auVar55[9] = 0;
  auVar55._0_9_ = auVar469._0_9_;
  auVar55._10_5_ = auVar45._10_5_;
  auVar65[8] = auVar469[4];
  auVar65._0_8_ = auVar469._0_8_;
  auVar65._9_6_ = auVar55._9_6_;
  auVar129._7_8_ = 0;
  auVar129._0_7_ = auVar65._8_7_;
  Var105 = CONCAT81(SUB158(auVar129 << 0x40,7),auVar469[3]);
  auVar150._9_6_ = 0;
  auVar150._0_9_ = Var105;
  auVar130._1_10_ = SUB1510(auVar150 << 0x30,5);
  auVar130[0] = auVar469[2];
  auVar151._11_4_ = 0;
  auVar151._0_11_ = auVar130;
  auVar79[2] = auVar469[1];
  auVar79._0_2_ = auVar469._0_2_;
  auVar79._3_12_ = SUB1512(auVar151 << 0x20,3);
  bVar437 = auVar469[9];
  bVar438 = auVar469[10];
  bVar439 = auVar469[0xb];
  bVar440 = auVar469[0xc];
  bVar441 = auVar469[0xd];
  bVar442 = auVar469[0xe];
  bVar443 = auVar469[0xf];
  sVar157 = auVar65._8_2_;
  sVar158 = auVar45._10_2_;
  sVar177 = auVar25._12_2_;
  uVar243 = (ushort)Var105;
  uVar241 = auVar130._0_2_;
  uVar239 = auVar79._2_2_;
  uVar428 = CONCAT22(auVar469._0_2_,(ushort)auVar469[8]) & 0xffffff;
  uVar217 = (ushort)uVar428;
  uVar465 = (ushort)(uVar428 >> 0x10);
  uVar427 = CONCAT11((uVar465 != 0) * (uVar465 < 0x100) * auVar469[0] - (0xff < uVar465),
                     (uVar217 != 0) * (uVar217 < 0x100) * auVar469[8] - (0xff < uVar217));
  uVar247 = CONCAT13((uVar239 != 0) * (uVar239 < 0x100) * auVar469[1] - (0xff < uVar239),
                     CONCAT12((bVar437 != 0) * (bVar437 < 0x100) * bVar437 - (0xff < bVar437),
                              uVar427));
  uVar429 = CONCAT15((uVar241 != 0) * (uVar241 < 0x100) * auVar469[2] - (0xff < uVar241),
                     CONCAT14((bVar438 != 0) * (bVar438 < 0x100) * bVar438 - (0xff < bVar438),
                              uVar247));
  uVar431 = CONCAT17((uVar243 != 0) * (uVar243 < 0x100) * auVar469[3] - (0xff < uVar243),
                     CONCAT16((bVar439 != 0) * (bVar439 < 0x100) * bVar439 - (0xff < bVar439),
                              uVar429));
  auVar432._0_10_ =
       CONCAT19((0 < sVar157) * (sVar157 < 0x100) * auVar469[4] - (0xff < sVar157),
                CONCAT18((bVar440 != 0) * (bVar440 < 0x100) * bVar440 - (0xff < bVar440),uVar431));
  auVar432[10] = (bVar441 != 0) * (bVar441 < 0x100) * bVar441 - (0xff < bVar441);
  auVar432[0xb] = (0 < sVar158) * (sVar158 < 0x100) * auVar469[5] - (0xff < sVar158);
  auVar433[0xc] = (bVar442 != 0) * (bVar442 < 0x100) * bVar442 - (0xff < bVar442);
  auVar433._0_12_ = auVar432;
  auVar433[0xd] = (0 < sVar177) * (sVar177 < 0x100) * auVar469[6] - (0xff < sVar177);
  auVar435[0xe] = (bVar443 != 0) * (bVar443 < 0x100) * bVar443 - (0xff < bVar443);
  auVar435._0_14_ = auVar433;
  auVar435[0xf] = (bVar436 != 0) * (bVar436 < 0x100) * bVar436 - (0xff < bVar436);
  bVar436 = auVar161[8];
  bVar437 = auVar161[9];
  bVar438 = auVar161[10];
  bVar439 = auVar161[0xb];
  bVar440 = auVar161[0xc];
  bVar441 = auVar161[0xd];
  bVar442 = auVar161[0xe];
  bVar443 = auVar161[0xf];
  bVar444 = auVar161[7];
  auVar16[0xd] = 0;
  auVar16._0_13_ = auVar161._0_13_;
  auVar16[0xe] = bVar444;
  auVar26[0xc] = auVar161[6];
  auVar26._0_12_ = auVar161._0_12_;
  auVar26._13_2_ = auVar16._13_2_;
  auVar36[0xb] = 0;
  auVar36._0_11_ = auVar161._0_11_;
  auVar36._12_3_ = auVar26._12_3_;
  auVar46[10] = auVar161[5];
  auVar46._0_10_ = auVar161._0_10_;
  auVar46._11_4_ = auVar36._11_4_;
  auVar56[9] = 0;
  auVar56._0_9_ = auVar161._0_9_;
  auVar56._10_5_ = auVar46._10_5_;
  auVar66[8] = auVar161[4];
  auVar66._0_8_ = auVar161._0_8_;
  auVar66._9_6_ = auVar56._9_6_;
  auVar131._7_8_ = 0;
  auVar131._0_7_ = auVar66._8_7_;
  Var105 = CONCAT81(SUB158(auVar131 << 0x40,7),auVar161[3]);
  auVar152._9_6_ = 0;
  auVar152._0_9_ = Var105;
  auVar132._1_10_ = SUB1510(auVar152 << 0x30,5);
  auVar132[0] = auVar161[2];
  auVar153._11_4_ = 0;
  auVar153._0_11_ = auVar132;
  auVar80[2] = auVar161[1];
  auVar80._0_2_ = auVar161._0_2_;
  auVar80._3_12_ = SUB1512(auVar153 << 0x20,3);
  uVar217 = auVar161._0_2_ & 0xff;
  sVar157 = auVar66._8_2_;
  sVar158 = auVar46._10_2_;
  sVar177 = auVar26._12_2_;
  uVar241 = (ushort)Var105;
  uVar239 = auVar132._0_2_;
  uVar465 = auVar80._2_2_;
  uVar246 = CONCAT11((bVar436 != 0) * (bVar436 < 0x100) * bVar436 - (0xff < bVar436),
                     ((auVar161 & (undefined1  [16])0xff) != (undefined1  [16])0x0) *
                     (uVar217 < 0x100) * auVar161[0] - (0xff < uVar217));
  uVar218 = CONCAT13((bVar437 != 0) * (bVar437 < 0x100) * bVar437 - (0xff < bVar437),
                     CONCAT12((uVar465 != 0) * (uVar465 < 0x100) * auVar161[1] - (0xff < uVar465),
                              uVar246));
  uVar248 = CONCAT15((bVar438 != 0) * (bVar438 < 0x100) * bVar438 - (0xff < bVar438),
                     CONCAT14((uVar239 != 0) * (uVar239 < 0x100) * auVar161[2] - (0xff < uVar239),
                              uVar218));
  uVar159 = CONCAT17((bVar439 != 0) * (bVar439 < 0x100) * bVar439 - (0xff < bVar439),
                     CONCAT16((uVar241 != 0) * (uVar241 < 0x100) * auVar161[3] - (0xff < uVar241),
                              uVar248));
  auVar250._0_10_ =
       CONCAT19((bVar440 != 0) * (bVar440 < 0x100) * bVar440 - (0xff < bVar440),
                CONCAT18((0 < sVar157) * (sVar157 < 0x100) * auVar161[4] - (0xff < sVar157),uVar159)
               );
  auVar250[10] = (0 < sVar158) * (sVar158 < 0x100) * auVar161[5] - (0xff < sVar158);
  auVar250[0xb] = (bVar441 != 0) * (bVar441 < 0x100) * bVar441 - (0xff < bVar441);
  auVar252[0xc] = (0 < sVar177) * (sVar177 < 0x100) * auVar161[6] - (0xff < sVar177);
  auVar252._0_12_ = auVar250;
  auVar252[0xd] = (bVar442 != 0) * (bVar442 < 0x100) * bVar442 - (0xff < bVar442);
  auVar263[0xe] = (bVar444 != 0) * (bVar444 < 0x100) * bVar444 - (0xff < bVar444);
  auVar263._0_14_ = auVar252;
  auVar263[0xf] = (bVar443 != 0) * (bVar443 < 0x100) * bVar443 - (0xff < bVar443);
  auVar238[0xe] = auVar221[7];
  auVar238._0_14_ = auVar221;
  auVar238[0xf] = uVar327;
  auVar237._14_2_ = auVar238._14_2_;
  auVar237._0_13_ = auVar221._0_13_;
  auVar237[0xd] = uVar305;
  auVar236._13_3_ = auVar237._13_3_;
  auVar236._0_12_ = auVar221._0_12_;
  auVar236[0xc] = auVar221[6];
  auVar235._12_4_ = auVar236._12_4_;
  auVar235._0_11_ = auVar221._0_11_;
  auVar235[0xb] = uVar304;
  auVar234._11_5_ = auVar235._11_5_;
  auVar234._0_10_ = auVar221._0_10_;
  auVar234[10] = auVar221[5];
  auVar233._10_6_ = auVar234._10_6_;
  auVar233._0_9_ = auVar221._0_9_;
  auVar233[9] = uVar278;
  auVar232._9_7_ = auVar233._9_7_;
  auVar232._0_8_ = auVar221._0_8_;
  auVar232[8] = auVar221[4];
  Var95 = CONCAT91(CONCAT81(auVar232._8_8_,uVar277),auVar221[3]);
  auVar134._2_10_ = Var95;
  auVar134[1] = uVar203;
  auVar134[0] = auVar221[2];
  auVar133._2_12_ = auVar134;
  auVar133[1] = uVar202;
  auVar133[0] = auVar221[1];
  auVar168._0_12_ = auVar353._0_12_;
  auVar168._12_2_ = (short)Var92;
  auVar168._14_2_ = (short)((ulong)uVar431 >> 0x30);
  auVar167._12_4_ = auVar168._12_4_;
  auVar167._0_10_ = auVar353._0_10_;
  auVar167._10_2_ = (short)((uint6)uVar429 >> 0x20);
  auVar166._10_6_ = auVar167._10_6_;
  auVar166._0_8_ = auVar353._0_8_;
  auVar166._8_2_ = auVar128._0_2_;
  auVar135._4_8_ = auVar166._8_8_;
  auVar135._2_2_ = (short)((uint)uVar247 >> 0x10);
  auVar135._0_2_ = auVar127._0_2_;
  auVar291._12_2_ = (short)((ulong)uVar159 >> 0x30);
  auVar291._0_12_ = auVar250;
  auVar291._14_2_ = (short)Var95;
  auVar290._12_4_ = auVar291._12_4_;
  auVar290._10_2_ = auVar134._0_2_;
  auVar290._0_10_ = auVar250._0_10_;
  auVar289._10_6_ = auVar290._10_6_;
  auVar289._8_2_ = (short)((uint6)uVar248 >> 0x20);
  auVar289._0_8_ = uVar159;
  auVar288._8_8_ = auVar289._8_8_;
  auVar288._6_2_ = auVar133._0_2_;
  auVar288._0_6_ = uVar248;
  auVar287._6_10_ = auVar288._6_10_;
  auVar287._4_2_ = (short)((uint)uVar218 >> 0x10);
  auVar287._0_4_ = uVar218;
  uVar247 = CONCAT22((short)((unkuint10)auVar432._0_10_ >> 0x40),auVar354._8_2_);
  auVar339._0_8_ = CONCAT26(auVar432._10_2_,CONCAT24(auVar356._10_2_,uVar247));
  auVar339._8_2_ = auVar358._12_2_;
  auVar339._10_2_ = auVar433._12_2_;
  auVar361._12_2_ = auVar359._14_2_;
  auVar361._0_12_ = auVar339;
  auVar361._14_2_ = auVar435._14_2_;
  uVar218 = CONCAT22(auVar232._8_2_,(short)((unkuint10)auVar250._0_10_ >> 0x40));
  auVar251._0_8_ = CONCAT26(auVar234._10_2_,CONCAT24(auVar250._10_2_,uVar218));
  auVar251._8_2_ = auVar252._12_2_;
  auVar251._10_2_ = auVar236._12_2_;
  auVar264._12_2_ = auVar263._14_2_;
  auVar264._0_12_ = auVar251;
  auVar264._14_2_ = auVar237._14_2_;
  *(ulong *)(s + -4) =
       CONCAT44(CONCAT22(CONCAT11(uVar242,auVar221[0]),uVar246),CONCAT22(uVar427,auVar353._0_2_));
  *(ulong *)(s + lVar154 + -4) = CONCAT44(auVar287._4_4_,auVar135._0_4_);
  *(ulong *)(s + lVar154 * 2 + -4) = CONCAT44(auVar289._8_4_,auVar166._8_4_);
  uVar159 = CONCAT44(auVar290._12_4_,auVar167._12_4_);
  *(undefined8 *)(s + lVar154 * 3 + -4) = uVar159;
  *(ulong *)(s + lVar154 * 4 + -4) = CONCAT44(uVar218,uVar247);
  *(ulong *)(s + lVar154 * 5 + -4) =
       CONCAT44((int)((ulong)auVar251._0_8_ >> 0x20),(int)((ulong)auVar339._0_8_ >> 0x20));
  *(ulong *)(s + lVar154 * 6 + -4) = CONCAT44(auVar251._8_4_,auVar339._8_4_);
  *(ulong *)(s + lVar154 * 7 + -4) = CONCAT44(auVar264._12_4_,auVar361._12_4_);
  return;
}

Assistant:

void aom_lpf_vertical_8_dual_sse2(uint8_t *s, int p, const uint8_t *_blimit0,
                                  const uint8_t *_limit0,
                                  const uint8_t *_thresh0,
                                  const uint8_t *_blimit1,
                                  const uint8_t *_limit1,
                                  const uint8_t *_thresh1) {
  __m128i blimit = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_blimit0),
                                      _mm_load_si128((__m128i *)_blimit1));
  __m128i limit = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_limit0),
                                     _mm_load_si128((__m128i *)_limit1));
  __m128i thresh = _mm_unpacklo_epi32(_mm_load_si128((__m128i *)_thresh0),
                                      _mm_load_si128((__m128i *)_thresh1));

  __m128i x0, x1, x2, x3, x4, x5, x6, x7;
  __m128i d1, d3, d5, d7;
  __m128i q1q0, p1p0;
  __m128i p1, q1;
  __m128i d0d1, d2d3, d4d5, d6d7;

  x0 = _mm_loadl_epi64((__m128i *)(s - 4 + 0 * p));
  x1 = _mm_loadl_epi64((__m128i *)(s - 4 + 1 * p));
  x2 = _mm_loadl_epi64((__m128i *)(s - 4 + 2 * p));
  x3 = _mm_loadl_epi64((__m128i *)(s - 4 + 3 * p));
  x4 = _mm_loadl_epi64((__m128i *)(s - 4 + 4 * p));
  x5 = _mm_loadl_epi64((__m128i *)(s - 4 + 5 * p));
  x6 = _mm_loadl_epi64((__m128i *)(s - 4 + 6 * p));
  x7 = _mm_loadl_epi64((__m128i *)(s - 4 + 7 * p));

  transpose8x8_sse2(&x0, &x1, &x2, &x3, &x4, &x5, &x6, &x7, &d0d1, &d2d3, &d4d5,
                    &d6d7);

  d1 = _mm_srli_si128(d0d1, 8);
  d3 = _mm_srli_si128(d2d3, 8);
  d5 = _mm_srli_si128(d4d5, 8);
  d7 = _mm_srli_si128(d6d7, 8);

  lpf_internal_8_dual_sse2(&d0d1, &d7, &d1, &d6d7, &d2d3, &d5, &d3, &d4d5,
                           &q1q0, &p1p0, &blimit, &limit, &thresh);

  p1 = _mm_srli_si128(p1p0, 8);
  q1 = _mm_srli_si128(q1q0, 8);

  transpose8x8_sse2(&d0d1, &d1, &p1, &p1p0, &q1q0, &q1, &d6d7, &d7, &d0d1,
                    &d2d3, &d4d5, &d6d7);

  _mm_storel_epi64((__m128i *)(s - 4 + 0 * p), d0d1);
  _mm_storel_epi64((__m128i *)(s - 4 + 1 * p), _mm_srli_si128(d0d1, 8));
  _mm_storel_epi64((__m128i *)(s - 4 + 2 * p), d2d3);
  _mm_storel_epi64((__m128i *)(s - 4 + 3 * p), _mm_srli_si128(d2d3, 8));
  _mm_storel_epi64((__m128i *)(s - 4 + 4 * p), d4d5);
  _mm_storel_epi64((__m128i *)(s - 4 + 5 * p), _mm_srli_si128(d4d5, 8));
  _mm_storel_epi64((__m128i *)(s - 4 + 6 * p), d6d7);
  _mm_storel_epi64((__m128i *)(s - 4 + 7 * p), _mm_srli_si128(d6d7, 8));
}